

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_fma::forward_fp16s
          (InnerProduct_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int *piVar14;
  void *pvVar15;
  void *pvVar16;
  size_t sVar17;
  uint *puVar18;
  float *pfVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  undefined1 (*pauVar32) [16];
  undefined1 (*pauVar33) [32];
  long lVar34;
  undefined4 *puVar35;
  long lVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  uint uVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  uint uVar50;
  undefined1 (*pauVar51) [16];
  long lVar52;
  undefined1 (*pauVar53) [16];
  long lVar54;
  undefined1 (*pauVar55) [32];
  long lVar56;
  undefined1 (*pauVar57) [16];
  undefined1 auVar58 [16];
  undefined1 auVar66 [16];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [28];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar59 [16];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar128 [64];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar161 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar132 [16];
  undefined1 auVar171 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar141 [16];
  undefined1 auVar183 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar184 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar185 [64];
  float fVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar218 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [64];
  v4sf one;
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar285 [64];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  float fVar304;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  float fVar316;
  float fVar318;
  float fVar319;
  float fVar320;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  float fVar317;
  float fVar321;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [32];
  undefined1 auVar322 [16];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [64];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [64];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [64];
  undefined1 auVar358 [16];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [64];
  Option opt_flatten;
  undefined4 in_stack_fffffffffffffbec;
  undefined1 local_3c8 [16];
  size_t local_3b8;
  int local_3b0;
  Allocator *local_3a8;
  int local_3a0;
  int local_39c;
  undefined8 local_398;
  int local_390;
  size_t local_388;
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  long local_308;
  ulong local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  ulong local_2c0;
  float local_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined1 local_2a8 [32];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined8 local_238;
  ulong local_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar81 [32];
  undefined1 auVar85 [32];
  undefined1 auVar91 [32];
  float fVar94;
  undefined1 auVar120 [32];
  float fVar129;
  undefined1 auVar162 [32];
  
  local_3a0 = bottom_blob->dims;
  if (local_3a0 == 2) {
    iVar37 = (this->super_InnerProduct).num_output;
    local_39c = bottom_blob->w;
    if (local_39c == (this->super_InnerProduct).weight_data_size / iVar37) {
      Mat::create(top_blob,iVar37,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                  opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      innerproduct_gemm_fp16s_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 (Mat *)(this->super_InnerProduct).bias_data.data,
                 (this->super_InnerProduct).activation_type,
                 &(this->super_InnerProduct).activation_params,
                 (Option *)CONCAT44(in_stack_fffffffffffffbec,(uint)opt->use_packing_layout));
      return 0;
    }
  }
  else {
    local_39c = bottom_blob->w;
  }
  piVar14 = bottom_blob->refcount;
  local_3c8._0_8_ = bottom_blob->data;
  local_3c8._8_8_ = bottom_blob->refcount;
  local_3b8 = bottom_blob->elemsize;
  local_3b0 = bottom_blob->elempack;
  local_3a8 = bottom_blob->allocator;
  local_398._0_4_ = bottom_blob->h;
  local_398._4_4_ = bottom_blob->d;
  local_390 = bottom_blob->c;
  local_388 = bottom_blob->cstep;
  iVar37 = local_3a0;
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + 1;
    UNLOCK();
    iVar37 = bottom_blob->dims;
  }
  if (iVar37 != 1) {
    auVar269[0] = opt->lightmode;
    auVar269[1] = opt->use_shader_pack8;
    auVar269[2] = opt->use_subgroup_ops;
    auVar269[3] = opt->use_reserved_0;
    auVar269._4_4_ = opt->num_threads;
    auVar269._8_8_ = opt->blob_allocator;
    uVar2 = opt->workspace_allocator;
    uVar3 = opt->openmp_blocktime;
    uVar4 = opt->use_winograd_convolution;
    uVar5 = opt->use_sgemm_convolution;
    uVar6 = opt->use_int8_inference;
    uVar7 = opt->use_vulkan_compute;
    auVar269[0x1f] = uVar7;
    auVar269[0x1e] = uVar6;
    auVar269[0x1d] = uVar5;
    auVar269[0x1c] = uVar4;
    auVar269._24_4_ = uVar3;
    auVar269._16_8_ = uVar2;
    local_58._0_1_ = opt->use_bf16_storage;
    local_58._1_1_ = opt->use_fp16_packed;
    local_58._2_1_ = opt->use_fp16_storage;
    local_58._3_1_ = opt->use_fp16_arithmetic;
    local_58._4_1_ = opt->use_int8_packed;
    local_58._5_1_ = opt->use_int8_storage;
    local_58._6_1_ = opt->use_int8_arithmetic;
    local_58._7_1_ = opt->use_packing_layout;
    uStack_50._0_4_ = opt->vulkan_device_index;
    uStack_50._4_1_ = opt->use_reserved_1;
    uStack_50._5_1_ = opt->use_image_storage;
    uStack_50._6_1_ = opt->use_tensor_storage;
    uStack_50._7_1_ = opt->use_reserved_2;
    uStack_48._0_4_ = opt->flush_denormals;
    uStack_48._4_1_ = opt->use_local_pool_allocator;
    uStack_48._5_1_ = opt->use_shader_local_memory;
    uStack_48._6_1_ = opt->use_cooperative_matrix;
    uStack_48._7_1_ = opt->use_winograd23_convolution;
    uStack_40._0_1_ = opt->use_winograd43_convolution;
    uStack_40._1_1_ = opt->use_winograd63_convolution;
    uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = opt->use_fp16_uniform;
    uStack_40._4_1_ = opt->use_int8_uniform;
    uStack_40._5_1_ = opt->use_reserved_9;
    uStack_40._6_1_ = opt->use_reserved_10;
    uStack_40._7_1_ = opt->use_reserved_11;
    local_78 = auVar269._0_8_;
    pAStack_70 = opt->workspace_allocator;
    auStack_68 = auVar269._16_16_;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,local_3c8);
    if ((local_3c8._0_8_ == 0) || ((long)local_390 * local_388 == 0)) {
      iVar37 = -100;
      goto LAB_002ec1a0;
    }
  }
  uVar28 = (this->super_InnerProduct).num_output;
  uVar50 = 1;
  if (opt->use_packing_layout == true) {
    uVar50 = 8;
    if ((uVar28 & 7) != 0) {
      uVar50 = (uint)((uVar28 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,(int)uVar28 / (int)uVar50,
              (ulong)uVar50 * (local_3b8 / (ulong)(long)local_3b0),uVar50,opt->blob_allocator);
  iVar37 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar13 = (this->super_InnerProduct).activation_type;
    pvVar15 = (this->super_InnerProduct).bias_data.data;
    uVar50 = local_3b0 * local_39c;
    iVar29 = top_blob->elempack;
    uVar28 = top_blob->w;
    if (iVar29 == 1) {
      if (0 < (int)uVar28 >> 3) {
        local_220 = (ulong)(uint)((int)uVar28 >> 3);
        lVar38 = 7;
        lVar34 = 6;
        lVar36 = 5;
        lVar39 = 4;
        lVar41 = 3;
        lVar54 = 2;
        lVar56 = 1;
        local_308 = 0;
        uVar30 = 0;
        do {
          local_2c0 = uVar30 * 8;
          auVar285 = ZEXT1664(ZEXT816(0) << 0x40);
          if (pvVar15 != (void *)0x0) {
            auVar285 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar15 + uVar30 * 0x20));
          }
          auVar269 = auVar285._0_32_;
          lVar31 = (long)(this->weight_data_tm).w;
          pvVar16 = (this->weight_data_tm).data;
          sVar17 = (this->weight_data_tm).elemsize;
          lVar44 = local_3c8._0_8_;
          if ((int)uVar50 < 8) {
            lVar31 = sVar17 * lVar31;
            lVar52 = lVar31 * local_2c0;
            lVar43 = (local_2c0 | 1) * lVar31;
            lVar42 = (local_2c0 | 2) * lVar31;
            lVar49 = (local_2c0 | 3) * lVar31;
            lVar48 = (local_2c0 | 4) * lVar31;
            lVar47 = (local_2c0 | 5) * lVar31;
            lVar46 = (local_2c0 | 6) * lVar31;
            lVar45 = lVar31 * (local_2c0 | 7);
            uVar27 = 0;
            local_b8 = SUB6432(ZEXT864(0),0);
            local_d8 = SUB6432(ZEXT864(0),0);
            local_f8 = SUB6432(ZEXT864(0),0);
            local_118 = SUB6432(ZEXT864(0),0);
            local_138 = SUB6432(ZEXT864(0),0);
            local_158 = SUB6432(ZEXT864(0),0);
            local_178 = SUB6432(ZEXT864(0),0);
            local_98 = SUB6432(ZEXT864(0),0);
          }
          else {
            lVar45 = sVar17 * lVar38 * lVar31;
            local_2a8._0_8_ = lVar45;
            lVar46 = sVar17 * lVar34 * lVar31;
            lVar47 = sVar17 * lVar36 * lVar31;
            lVar48 = sVar17 * lVar39 * lVar31;
            lVar49 = sVar17 * lVar41 * lVar31;
            lVar42 = sVar17 * lVar54 * lVar31;
            lVar43 = sVar17 * lVar56 * lVar31;
            lVar31 = sVar17 * local_308 * lVar31;
            auVar128 = ZEXT864(0);
            auVar357 = ZEXT864(0);
            auVar351 = ZEXT864(0);
            auVar332 = ZEXT864(0);
            auVar263 = ZEXT864(0);
            auVar376 = ZEXT864(0);
            auVar210 = ZEXT864(0);
            auVar185 = ZEXT864(0);
            iVar37 = 7;
            lVar52 = 0;
            do {
              auVar90 = *(undefined1 (*) [32])(local_3c8._0_8_ + lVar52 * 2);
              auVar131 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar16 + lVar52 + lVar31));
              auVar77 = vcvtph2ps_f16c(auVar131);
              auVar131 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar16 + lVar52 + lVar43));
              auVar88 = vcvtph2ps_f16c(auVar131);
              auVar131 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar16 + lVar52 + lVar42));
              auVar127 = vcvtph2ps_f16c(auVar131);
              auVar131 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar16 + lVar52 + lVar49));
              auVar183 = vcvtph2ps_f16c(auVar131);
              auVar131 = vfmadd231ps_fma(auVar128._0_32_,auVar90,auVar77);
              auVar128 = ZEXT1664(auVar131);
              local_98 = ZEXT1632(auVar131);
              auVar131 = vfmadd231ps_fma(auVar357._0_32_,auVar90,auVar88);
              auVar357 = ZEXT1664(auVar131);
              local_178 = ZEXT1632(auVar131);
              auVar131 = vfmadd231ps_fma(auVar351._0_32_,auVar90,auVar127);
              auVar351 = ZEXT1664(auVar131);
              local_158 = ZEXT1632(auVar131);
              auVar131 = vfmadd231ps_fma(auVar332._0_32_,auVar90,auVar183);
              auVar332 = ZEXT1664(auVar131);
              local_138 = ZEXT1632(auVar131);
              auVar131 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar16 + lVar52 + lVar48));
              auVar77 = vcvtph2ps_f16c(auVar131);
              auVar131 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar16 + lVar52 + lVar47));
              auVar88 = vcvtph2ps_f16c(auVar131);
              auVar131 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar16 + lVar52 + lVar46));
              auVar127 = vcvtph2ps_f16c(auVar131);
              auVar131 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar16 + lVar52 + lVar45));
              auVar183 = vcvtph2ps_f16c(auVar131);
              auVar131 = vfmadd231ps_fma(auVar263._0_32_,auVar90,auVar77);
              auVar263 = ZEXT1664(auVar131);
              local_118 = ZEXT1632(auVar131);
              auVar131 = vfmadd231ps_fma(auVar376._0_32_,auVar90,auVar88);
              auVar376 = ZEXT1664(auVar131);
              local_f8 = ZEXT1632(auVar131);
              auVar131 = vfmadd231ps_fma(auVar210._0_32_,auVar90,auVar127);
              auVar210 = ZEXT1664(auVar131);
              local_d8 = ZEXT1632(auVar131);
              auVar131 = vfmadd231ps_fma(auVar185._0_32_,auVar90,auVar183);
              auVar185 = ZEXT1664(auVar131);
              local_b8 = ZEXT1632(auVar131);
              lVar44 = lVar44 + 0x20;
              iVar37 = iVar37 + 8;
              lVar52 = lVar52 + 0x10;
            } while (iVar37 < (int)uVar50);
            lVar45 = lVar45 + lVar52;
            lVar46 = lVar46 + lVar52;
            lVar47 = lVar47 + lVar52;
            lVar48 = lVar48 + lVar52;
            lVar49 = lVar49 + lVar52;
            lVar42 = lVar42 + lVar52;
            lVar43 = lVar43 + lVar52;
            lVar52 = lVar31 + lVar52;
            uVar27 = uVar50 & 0xfffffff8;
          }
          local_348._0_8_ = (long)pvVar16 + lVar43;
          local_358._0_8_ = (long)pvVar16 + lVar42;
          local_368._0_8_ = (long)pvVar16 + lVar49;
          local_378._0_8_ = (long)pvVar16 + lVar48;
          local_300 = uVar30;
          local_2f8 = lVar56;
          local_2f0 = lVar54;
          local_2e8 = lVar41;
          local_2e0 = lVar39;
          local_2d8 = lVar36;
          local_2d0 = lVar34;
          local_2c8 = lVar38;
          if ((int)uVar27 < (int)uVar50) {
            lVar38 = 0;
            do {
              local_2a8 = auVar285._0_32_;
              local_318 = ZEXT416(*(uint *)(lVar44 + lVar38 * 4));
              fVar94 = float16_to_float32(*(unsigned_short *)((long)pvVar16 + lVar38 * 2 + lVar52));
              auVar269 = _local_218;
              local_218._4_4_ = extraout_XMM0_Db;
              local_218._0_4_ = fVar94;
              fStack_210 = (float)extraout_XMM0_Dc;
              _fStack_208 = auVar269._16_16_;
              fStack_20c = (float)extraout_XMM0_Dd;
              _local_328 = ZEXT416(*(uint *)(lVar44 + lVar38 * 4));
              fVar94 = float16_to_float32(*(unsigned_short *)(local_348._0_8_ + lVar38 * 2));
              local_238 = CONCAT44(extraout_XMM0_Db_00,fVar94);
              local_338 = ZEXT416(*(uint *)(lVar44 + lVar38 * 4));
              local_248._0_4_ =
                   float16_to_float32(*(unsigned_short *)(local_358._0_8_ + lVar38 * 2));
              local_248._4_4_ = extraout_XMM0_Db_01;
              local_248._8_4_ = extraout_XMM0_Dc_00;
              local_248._12_4_ = extraout_XMM0_Dd_00;
              local_258 = ZEXT416(*(uint *)(lVar44 + lVar38 * 4));
              local_268._0_4_ =
                   float16_to_float32(*(unsigned_short *)(local_368._0_8_ + lVar38 * 2));
              local_268._4_4_ = extraout_XMM0_Db_02;
              local_268._8_4_ = extraout_XMM0_Dc_01;
              local_268._12_4_ = extraout_XMM0_Dd_01;
              local_278 = ZEXT416(*(uint *)(lVar44 + lVar38 * 4));
              local_2b8 = float16_to_float32(*(unsigned_short *)(local_378._0_8_ + lVar38 * 2));
              local_288 = ZEXT416(*(uint *)(lVar44 + lVar38 * 4));
              uStack_2b4 = extraout_XMM0_Db_03;
              uStack_2b0 = extraout_XMM0_Dc_02;
              uStack_2ac = extraout_XMM0_Dd_02;
              fVar94 = float16_to_float32(*(unsigned_short *)((long)pvVar16 + lVar38 * 2 + lVar47));
              auVar269 = local_198;
              local_198._4_4_ = extraout_XMM0_Db_04;
              local_198._0_4_ = fVar94;
              local_198._8_4_ = extraout_XMM0_Dc_03;
              local_198._16_16_ = auVar269._16_16_;
              local_198._12_4_ = extraout_XMM0_Dd_03;
              local_1b8._0_16_ = ZEXT416(*(uint *)(lVar44 + lVar38 * 4));
              fVar94 = float16_to_float32(*(unsigned_short *)((long)pvVar16 + lVar38 * 2 + lVar46));
              auVar269 = local_1d8;
              local_1d8._4_4_ = extraout_XMM0_Db_05;
              local_1d8._0_4_ = fVar94;
              local_1d8._8_4_ = extraout_XMM0_Dc_04;
              local_1d8._16_16_ = auVar269._16_16_;
              local_1d8._12_4_ = extraout_XMM0_Dd_04;
              local_1f8._0_16_ = ZEXT416(*(uint *)(lVar44 + lVar38 * 4));
              auVar285._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar16 + lVar38 * 2 + lVar45));
              auVar285._4_60_ = extraout_var;
              auVar131._4_4_ = uStack_2b4;
              auVar131._0_4_ = local_2b8;
              auVar131._8_4_ = uStack_2b0;
              auVar131._12_4_ = uStack_2ac;
              auVar131 = vinsertps_avx(auVar131,ZEXT416((uint)local_198._0_4_),0x10);
              auVar131 = vinsertps_avx(auVar131,ZEXT416((uint)local_1d8._0_4_),0x20);
              auVar131 = vinsertps_avx(auVar131,auVar285._0_16_,0x30);
              auVar187 = vinsertps_avx(_local_218,ZEXT416((uint)local_238),0x10);
              auVar187 = vinsertps_avx(auVar187,ZEXT416((uint)local_248._0_4_),0x20);
              auVar187 = vinsertps_avx(auVar187,ZEXT416((uint)local_268._0_4_),0x30);
              auVar90._16_16_ = auVar131;
              auVar90._0_16_ = auVar187;
              auVar131 = vinsertps_avx(local_278,ZEXT416((uint)local_288._0_4_),0x10);
              auVar131 = vinsertps_avx(auVar131,ZEXT416((uint)local_1b8._0_4_),0x20);
              auVar131 = vinsertps_avx(auVar131,ZEXT416((uint)local_1f8._0_4_),0x30);
              auVar187 = vinsertps_avx(local_318,ZEXT416((uint)local_328._0_4_),0x10);
              auVar187 = vinsertps_avx(auVar187,ZEXT416((uint)local_338._0_4_),0x20);
              auVar187 = vinsertps_avx(auVar187,ZEXT416((uint)local_258._0_4_),0x30);
              auVar77._16_16_ = auVar131;
              auVar77._0_16_ = auVar187;
              auVar131 = vfmadd231ps_fma(local_2a8,auVar90,auVar77);
              auVar285 = ZEXT1664(auVar131);
              auVar269 = ZEXT1632(auVar131);
              lVar38 = lVar38 + 1;
            } while (uVar50 - uVar27 != (int)lVar38);
          }
          auVar90 = vhaddps_avx(local_98,local_178);
          auVar77 = vhaddps_avx(local_158,local_138);
          auVar77 = vhaddps_avx(auVar90,auVar77);
          auVar90 = vhaddps_avx(local_118,local_f8);
          auVar88 = vhaddps_avx(local_d8,local_b8);
          auVar88 = vhaddps_avx(auVar90,auVar88);
          auVar90 = vblendps_avx(auVar77,auVar88,0xf0);
          auVar77 = vperm2f128_avx(auVar77,auVar88,0x21);
          fVar94 = auVar77._0_4_ + auVar269._0_4_ + auVar90._0_4_;
          fVar129 = auVar77._4_4_ + auVar269._4_4_ + auVar90._4_4_;
          auVar88._0_8_ = CONCAT44(fVar129,fVar94);
          auVar88._8_4_ = auVar77._8_4_ + auVar269._8_4_ + auVar90._8_4_;
          auVar88._12_4_ = auVar77._12_4_ + auVar269._12_4_ + auVar90._12_4_;
          auVar88._16_4_ = auVar77._16_4_ + auVar269._16_4_ + auVar90._16_4_;
          auVar88._20_4_ = auVar77._20_4_ + auVar269._20_4_ + auVar90._20_4_;
          auVar88._24_4_ = auVar77._24_4_ + auVar269._24_4_ + auVar90._24_4_;
          auVar88._28_4_ = auVar77._28_4_ + auVar269._28_4_ + auVar90._28_4_;
          switch(iVar13) {
          case 1:
            auVar88 = vmaxps_avx(auVar88,_DAT_005a85e0);
            break;
          case 2:
            auVar269 = vmaxps_avx(auVar88,ZEXT832(0) << 0x20);
            auVar90 = vminps_avx(auVar88,ZEXT832(0) << 0x20);
            uVar1 = *(this->super_InnerProduct).activation_params.data;
            auVar93._4_4_ = uVar1;
            auVar93._0_4_ = uVar1;
            auVar93._8_4_ = uVar1;
            auVar93._12_4_ = uVar1;
            auVar93._16_4_ = uVar1;
            auVar93._20_4_ = uVar1;
            auVar93._24_4_ = uVar1;
            auVar93._28_4_ = uVar1;
            auVar131 = vfmadd213ps_fma(auVar93,auVar90,auVar269);
            auVar88 = ZEXT1632(auVar131);
            break;
          case 3:
            puVar35 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar1 = *puVar35;
            auVar122._4_4_ = uVar1;
            auVar122._0_4_ = uVar1;
            auVar122._8_4_ = uVar1;
            auVar122._12_4_ = uVar1;
            auVar122._16_4_ = uVar1;
            auVar122._20_4_ = uVar1;
            auVar122._24_4_ = uVar1;
            auVar122._28_4_ = uVar1;
            uVar1 = puVar35[1];
            auVar180._4_4_ = uVar1;
            auVar180._0_4_ = uVar1;
            auVar180._8_4_ = uVar1;
            auVar180._12_4_ = uVar1;
            auVar180._16_4_ = uVar1;
            auVar180._20_4_ = uVar1;
            auVar180._24_4_ = uVar1;
            auVar180._28_4_ = uVar1;
            auVar269 = vmaxps_avx(auVar88,auVar122);
            auVar88 = vminps_avx(auVar269,auVar180);
            break;
          case 4:
            auVar89._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
            auVar89._8_4_ = -auVar88._8_4_;
            auVar89._12_4_ = -auVar88._12_4_;
            auVar89._16_4_ = -auVar88._16_4_;
            auVar89._20_4_ = -auVar88._20_4_;
            auVar89._24_4_ = -auVar88._24_4_;
            auVar89._28_4_ = -auVar88._28_4_;
            auVar123._8_4_ = 0x42b0c0a5;
            auVar123._0_8_ = 0x42b0c0a542b0c0a5;
            auVar123._12_4_ = 0x42b0c0a5;
            auVar123._16_4_ = 0x42b0c0a5;
            auVar123._20_4_ = 0x42b0c0a5;
            auVar123._24_4_ = 0x42b0c0a5;
            auVar123._28_4_ = 0x42b0c0a5;
            auVar269 = vminps_avx(auVar89,auVar123);
            auVar124._8_4_ = 0xc2b0c0a5;
            auVar124._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar124._12_4_ = 0xc2b0c0a5;
            auVar124._16_4_ = 0xc2b0c0a5;
            auVar124._20_4_ = 0xc2b0c0a5;
            auVar124._24_4_ = 0xc2b0c0a5;
            auVar124._28_4_ = 0xc2b0c0a5;
            auVar90 = vmaxps_avx(auVar269,auVar124);
            auVar125._8_4_ = 0x3fb8aa3b;
            auVar125._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar125._12_4_ = 0x3fb8aa3b;
            auVar125._16_4_ = 0x3fb8aa3b;
            auVar125._20_4_ = 0x3fb8aa3b;
            auVar125._24_4_ = 0x3fb8aa3b;
            auVar125._28_4_ = 0x3fb8aa3b;
            auVar239._8_4_ = 0x3f000000;
            auVar239._0_8_ = 0x3f0000003f000000;
            auVar239._12_4_ = 0x3f000000;
            auVar239._16_4_ = 0x3f000000;
            auVar239._20_4_ = 0x3f000000;
            auVar239._24_4_ = 0x3f000000;
            auVar239._28_4_ = 0x3f000000;
            auVar131 = vfmadd213ps_fma(auVar125,auVar90,auVar239);
            auVar77 = vroundps_avx(ZEXT1632(auVar131),1);
            auVar269 = vcmpps_avx(ZEXT1632(auVar131),auVar77,1);
            auVar262._8_4_ = 0x3f800000;
            auVar262._0_8_ = 0x3f8000003f800000;
            auVar262._12_4_ = 0x3f800000;
            auVar262._16_4_ = 0x3f800000;
            auVar262._20_4_ = 0x3f800000;
            auVar262._24_4_ = 0x3f800000;
            auVar262._28_4_ = 0x3f800000;
            auVar269 = vandps_avx(auVar269,auVar262);
            auVar269 = vsubps_avx(auVar77,auVar269);
            auVar181._8_4_ = 0x3f318000;
            auVar181._0_8_ = 0x3f3180003f318000;
            auVar181._12_4_ = 0x3f318000;
            auVar181._16_4_ = 0x3f318000;
            auVar181._20_4_ = 0x3f318000;
            auVar181._24_4_ = 0x3f318000;
            auVar181._28_4_ = 0x3f318000;
            auVar131 = vfmsub231ps_fma(auVar90,auVar269,auVar181);
            auVar182._8_4_ = 0x395e8083;
            auVar182._0_8_ = 0x395e8083395e8083;
            auVar182._12_4_ = 0x395e8083;
            auVar182._16_4_ = 0x395e8083;
            auVar182._20_4_ = 0x395e8083;
            auVar182._24_4_ = 0x395e8083;
            auVar182._28_4_ = 0x395e8083;
            auVar187 = vfmsub231ps_fma(ZEXT1632(auVar131),auVar269,auVar182);
            auVar90 = ZEXT1632(auVar187);
            auVar25._28_4_ = 0x395e8083;
            auVar25._0_28_ =
                 ZEXT1628(CONCAT412(auVar187._12_4_ * auVar187._12_4_,
                                    CONCAT48(auVar187._8_4_ * auVar187._8_4_,
                                             CONCAT44(auVar187._4_4_ * auVar187._4_4_,
                                                      auVar187._0_4_ * auVar187._0_4_))));
            auVar209._8_4_ = 0x39506967;
            auVar209._0_8_ = 0x3950696739506967;
            auVar209._12_4_ = 0x39506967;
            auVar209._16_4_ = 0x39506967;
            auVar209._20_4_ = 0x39506967;
            auVar209._24_4_ = 0x39506967;
            auVar209._28_4_ = 0x39506967;
            auVar281._8_4_ = 0x3ab743ce;
            auVar281._0_8_ = 0x3ab743ce3ab743ce;
            auVar281._12_4_ = 0x3ab743ce;
            auVar281._16_4_ = 0x3ab743ce;
            auVar281._20_4_ = 0x3ab743ce;
            auVar281._24_4_ = 0x3ab743ce;
            auVar281._28_4_ = 0x3ab743ce;
            auVar131 = vfmadd213ps_fma(auVar209,auVar90,auVar281);
            auVar282._8_4_ = 0x3c088908;
            auVar282._0_8_ = 0x3c0889083c088908;
            auVar282._12_4_ = 0x3c088908;
            auVar282._16_4_ = 0x3c088908;
            auVar282._20_4_ = 0x3c088908;
            auVar282._24_4_ = 0x3c088908;
            auVar282._28_4_ = 0x3c088908;
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar282);
            auVar283._8_4_ = 0x3d2aa9c1;
            auVar283._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar283._12_4_ = 0x3d2aa9c1;
            auVar283._16_4_ = 0x3d2aa9c1;
            auVar283._20_4_ = 0x3d2aa9c1;
            auVar283._24_4_ = 0x3d2aa9c1;
            auVar283._28_4_ = 0x3d2aa9c1;
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar283);
            auVar284._8_4_ = 0x3e2aaaaa;
            auVar284._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar284._12_4_ = 0x3e2aaaaa;
            auVar284._16_4_ = 0x3e2aaaaa;
            auVar284._20_4_ = 0x3e2aaaaa;
            auVar284._24_4_ = 0x3e2aaaaa;
            auVar284._28_4_ = 0x3e2aaaaa;
            auVar90 = ZEXT1632(auVar187);
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar284);
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar239);
            auVar214 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar25,auVar90);
            auVar66._0_4_ = (int)auVar269._0_4_;
            auVar66._4_4_ = (int)auVar269._4_4_;
            auVar66._8_4_ = (int)auVar269._8_4_;
            auVar66._12_4_ = (int)auVar269._12_4_;
            auVar91._16_4_ = (int)auVar269._16_4_;
            auVar91._0_16_ = auVar66;
            auVar91._20_4_ = (int)auVar269._20_4_;
            auVar91._24_4_ = (int)auVar269._24_4_;
            auVar91._28_4_ = (int)auVar269._28_4_;
            auVar187 = vpslld_avx(auVar66,0x17);
            auVar131 = vpslld_avx(auVar91._16_16_,0x17);
            auVar141._8_4_ = 0x3f800000;
            auVar141._0_8_ = 0x3f8000003f800000;
            auVar141._12_4_ = 0x3f800000;
            auVar131 = vpaddd_avx(auVar131,auVar141);
            auVar187 = vpaddd_avx(auVar187,auVar141);
            auVar92._16_16_ = auVar131;
            auVar92._0_16_ = auVar187;
            auVar126._0_4_ = auVar214._0_4_ + 1.0;
            auVar126._4_4_ = auVar214._4_4_ + 1.0;
            auVar126._8_4_ = auVar214._8_4_ + 1.0;
            auVar126._12_4_ = auVar214._12_4_ + 1.0;
            auVar126._16_4_ = 0x3f800000;
            auVar126._20_4_ = 0x3f800000;
            auVar126._24_4_ = 0x3f800000;
            auVar126._28_4_ = 0x3f800000;
            auVar131 = vfmadd213ps_fma(auVar92,auVar126,auVar262);
            auVar88 = vdivps_avx(auVar262,ZEXT1632(auVar131));
            break;
          case 5:
            auVar303._8_4_ = 0x42b0c0a5;
            auVar303._0_8_ = 0x42b0c0a542b0c0a5;
            auVar303._12_4_ = 0x42b0c0a5;
            auVar303._16_4_ = 0x42b0c0a5;
            auVar303._20_4_ = 0x42b0c0a5;
            auVar303._24_4_ = 0x42b0c0a5;
            auVar303._28_4_ = 0x42b0c0a5;
            auVar269 = vminps_avx(auVar88,auVar303);
            auVar314._8_4_ = 0xc2b0c0a5;
            auVar314._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar314._12_4_ = 0xc2b0c0a5;
            auVar314._16_4_ = 0xc2b0c0a5;
            auVar314._20_4_ = 0xc2b0c0a5;
            auVar314._24_4_ = 0xc2b0c0a5;
            auVar314._28_4_ = 0xc2b0c0a5;
            auVar90 = vmaxps_avx(auVar314,auVar269);
            auVar172._8_4_ = 0x3fb8aa3b;
            auVar172._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar172._12_4_ = 0x3fb8aa3b;
            auVar172._16_4_ = 0x3fb8aa3b;
            auVar172._20_4_ = 0x3fb8aa3b;
            auVar172._24_4_ = 0x3fb8aa3b;
            auVar172._28_4_ = 0x3fb8aa3b;
            auVar331._8_4_ = 0x3f000000;
            auVar331._0_8_ = 0x3f0000003f000000;
            auVar331._12_4_ = 0x3f000000;
            auVar331._16_4_ = 0x3f000000;
            auVar331._20_4_ = 0x3f000000;
            auVar331._24_4_ = 0x3f000000;
            auVar331._28_4_ = 0x3f000000;
            auVar131 = vfmadd213ps_fma(auVar172,auVar90,auVar331);
            auVar77 = vroundps_avx(ZEXT1632(auVar131),1);
            auVar269 = vcmpps_avx(ZEXT1632(auVar131),auVar77,1);
            auVar350._8_4_ = 0x3f800000;
            auVar350._0_8_ = 0x3f8000003f800000;
            auVar350._12_4_ = 0x3f800000;
            auVar350._16_4_ = 0x3f800000;
            auVar350._20_4_ = 0x3f800000;
            auVar350._24_4_ = 0x3f800000;
            auVar350._28_4_ = 0x3f800000;
            auVar269 = vandps_avx(auVar350,auVar269);
            auVar269 = vsubps_avx(auVar77,auVar269);
            auVar356._8_4_ = 0x3f318000;
            auVar356._0_8_ = 0x3f3180003f318000;
            auVar356._12_4_ = 0x3f318000;
            auVar356._16_4_ = 0x3f318000;
            auVar356._20_4_ = 0x3f318000;
            auVar356._24_4_ = 0x3f318000;
            auVar356._28_4_ = 0x3f318000;
            auVar131 = vfmsub231ps_fma(auVar90,auVar269,auVar356);
            auVar315._8_4_ = 0xb95e8083;
            auVar315._0_8_ = 0xb95e8083b95e8083;
            auVar315._12_4_ = 0xb95e8083;
            auVar315._16_4_ = 0xb95e8083;
            auVar315._20_4_ = 0xb95e8083;
            auVar315._24_4_ = 0xb95e8083;
            auVar315._28_4_ = 0xb95e8083;
            auVar187 = vfnmsub231ps_fma(ZEXT1632(auVar131),auVar269,auVar315);
            auVar90 = ZEXT1632(auVar187);
            auVar111._28_4_ = auVar77._28_4_;
            auVar111._0_28_ =
                 ZEXT1628(CONCAT412(auVar187._12_4_ * auVar187._12_4_,
                                    CONCAT48(auVar187._8_4_ * auVar187._8_4_,
                                             CONCAT44(auVar187._4_4_ * auVar187._4_4_,
                                                      auVar187._0_4_ * auVar187._0_4_))));
            auVar369._8_4_ = 0x39506967;
            auVar369._0_8_ = 0x3950696739506967;
            auVar369._12_4_ = 0x39506967;
            auVar369._16_4_ = 0x39506967;
            auVar369._20_4_ = 0x39506967;
            auVar369._24_4_ = 0x39506967;
            auVar369._28_4_ = 0x39506967;
            auVar362._8_4_ = 0x3ab743ce;
            auVar362._0_8_ = 0x3ab743ce3ab743ce;
            auVar362._12_4_ = 0x3ab743ce;
            auVar362._16_4_ = 0x3ab743ce;
            auVar362._20_4_ = 0x3ab743ce;
            auVar362._24_4_ = 0x3ab743ce;
            auVar362._28_4_ = 0x3ab743ce;
            auVar131 = vfmadd213ps_fma(auVar369,auVar90,auVar362);
            auVar375._8_4_ = 0x3c088908;
            auVar375._0_8_ = 0x3c0889083c088908;
            auVar375._12_4_ = 0x3c088908;
            auVar375._16_4_ = 0x3c088908;
            auVar375._20_4_ = 0x3c088908;
            auVar375._24_4_ = 0x3c088908;
            auVar375._28_4_ = 0x3c088908;
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar375);
            auVar255._8_4_ = 0x3d2aa9c1;
            auVar255._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar255._12_4_ = 0x3d2aa9c1;
            auVar255._16_4_ = 0x3d2aa9c1;
            auVar255._20_4_ = 0x3d2aa9c1;
            auVar255._24_4_ = 0x3d2aa9c1;
            auVar255._28_4_ = 0x3d2aa9c1;
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar255);
            auVar256._8_4_ = 0x3e2aaaaa;
            auVar256._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar256._12_4_ = 0x3e2aaaaa;
            auVar256._16_4_ = 0x3e2aaaaa;
            auVar256._20_4_ = 0x3e2aaaaa;
            auVar256._24_4_ = 0x3e2aaaaa;
            auVar256._28_4_ = 0x3e2aaaaa;
            auVar90 = ZEXT1632(auVar187);
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar256);
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar331);
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar111,auVar90);
            auVar206._0_4_ = auVar131._0_4_ + 1.0;
            auVar206._4_4_ = auVar131._4_4_ + 1.0;
            auVar206._8_4_ = auVar131._8_4_ + 1.0;
            auVar206._12_4_ = auVar131._12_4_ + 1.0;
            auVar206._16_4_ = 0x3f800000;
            auVar206._20_4_ = 0x3f800000;
            auVar206._24_4_ = 0x3f800000;
            auVar206._28_4_ = 0x3f800000;
            auVar187._0_4_ = (int)auVar269._0_4_;
            auVar187._4_4_ = (int)auVar269._4_4_;
            auVar187._8_4_ = (int)auVar269._8_4_;
            auVar187._12_4_ = (int)auVar269._12_4_;
            auVar118._16_4_ = (int)auVar269._16_4_;
            auVar118._0_16_ = auVar187;
            auVar118._20_4_ = (int)auVar269._20_4_;
            auVar118._24_4_ = (int)auVar269._24_4_;
            auVar118._28_4_ = (int)auVar269._28_4_;
            auVar187 = vpslld_avx(auVar187,0x17);
            auVar131 = vpslld_avx(auVar118._16_16_,0x17);
            auVar288._8_4_ = 0x3f800000;
            auVar288._0_8_ = 0x3f8000003f800000;
            auVar288._12_4_ = 0x3f800000;
            auVar131 = vpaddd_avx(auVar131,auVar288);
            auVar187 = vpaddd_avx(auVar187,auVar288);
            auVar119._16_16_ = auVar131;
            auVar119._0_16_ = auVar187;
            auVar214 = vfmadd213ps_fma(auVar119,auVar206,auVar350);
            auVar173._8_4_ = 0x800000;
            auVar173._0_8_ = 0x80000000800000;
            auVar173._12_4_ = 0x800000;
            auVar173._16_4_ = 0x800000;
            auVar173._20_4_ = 0x800000;
            auVar173._24_4_ = 0x800000;
            auVar173._28_4_ = 0x800000;
            auVar269 = vmaxps_avx(ZEXT1632(auVar214),auVar173);
            auVar187 = vpsrld_avx(auVar269._0_16_,0x17);
            auVar131 = vpsrld_avx(auVar269._16_16_,0x17);
            auVar257._8_4_ = 0x807fffff;
            auVar257._0_8_ = 0x807fffff807fffff;
            auVar257._12_4_ = 0x807fffff;
            auVar257._16_4_ = 0x807fffff;
            auVar257._20_4_ = 0x807fffff;
            auVar257._24_4_ = 0x807fffff;
            auVar257._28_4_ = 0x807fffff;
            auVar269 = vandps_avx(auVar269,auVar257);
            auVar77 = vorps_avx(auVar331,auVar269);
            auVar258._8_4_ = 0x3f3504f3;
            auVar258._0_8_ = 0x3f3504f33f3504f3;
            auVar258._12_4_ = 0x3f3504f3;
            auVar258._16_4_ = 0x3f3504f3;
            auVar258._20_4_ = 0x3f3504f3;
            auVar258._24_4_ = 0x3f3504f3;
            auVar258._28_4_ = 0x3f3504f3;
            auVar90 = vcmpps_avx(auVar258,auVar77,2);
            auVar269 = vandnps_avx(auVar90,auVar77);
            auVar344._8_4_ = 0xbf800000;
            auVar344._0_8_ = 0xbf800000bf800000;
            auVar344._12_4_ = 0xbf800000;
            auVar344._16_4_ = 0xbf800000;
            auVar344._20_4_ = 0xbf800000;
            auVar344._24_4_ = 0xbf800000;
            auVar344._28_4_ = 0xbf800000;
            auVar174._0_4_ = auVar77._0_4_ + -1.0 + auVar269._0_4_;
            auVar174._4_4_ = auVar77._4_4_ + -1.0 + auVar269._4_4_;
            auVar174._8_4_ = auVar77._8_4_ + -1.0 + auVar269._8_4_;
            auVar174._12_4_ = auVar77._12_4_ + -1.0 + auVar269._12_4_;
            auVar174._16_4_ = auVar77._16_4_ + -1.0 + auVar269._16_4_;
            auVar174._20_4_ = auVar77._20_4_ + -1.0 + auVar269._20_4_;
            auVar174._24_4_ = auVar77._24_4_ + -1.0 + auVar269._24_4_;
            auVar174._28_4_ = auVar77._28_4_ + -1.0 + auVar269._28_4_;
            auVar131 = vpsubd_avx(auVar131,auVar90._16_16_);
            auVar265._8_4_ = 0xffffff81;
            auVar265._0_8_ = 0xffffff81ffffff81;
            auVar265._12_4_ = 0xffffff81;
            auVar131 = vpaddd_avx(auVar131,auVar265);
            auVar187 = vpsubd_avx(auVar187,auVar90._0_16_);
            auVar187 = vpaddd_avx(auVar187,auVar265);
            auVar207._16_16_ = auVar131;
            auVar207._0_16_ = auVar187;
            auVar238._0_4_ = auVar174._0_4_ * auVar174._0_4_;
            auVar238._4_4_ = auVar174._4_4_ * auVar174._4_4_;
            auVar238._8_4_ = auVar174._8_4_ * auVar174._8_4_;
            auVar238._12_4_ = auVar174._12_4_ * auVar174._12_4_;
            auVar238._16_4_ = auVar174._16_4_ * auVar174._16_4_;
            auVar238._20_4_ = auVar174._20_4_ * auVar174._20_4_;
            auVar238._24_4_ = auVar174._24_4_ * auVar174._24_4_;
            auVar238._28_4_ = 0;
            auVar259._8_4_ = 0x3d9021bb;
            auVar259._0_8_ = 0x3d9021bb3d9021bb;
            auVar259._12_4_ = 0x3d9021bb;
            auVar259._16_4_ = 0x3d9021bb;
            auVar259._20_4_ = 0x3d9021bb;
            auVar259._24_4_ = 0x3d9021bb;
            auVar259._28_4_ = 0x3d9021bb;
            auVar271._8_4_ = 0xbdebd1b8;
            auVar271._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar271._12_4_ = 0xbdebd1b8;
            auVar271._16_4_ = 0xbdebd1b8;
            auVar271._20_4_ = 0xbdebd1b8;
            auVar271._24_4_ = 0xbdebd1b8;
            auVar271._28_4_ = 0xbdebd1b8;
            auVar131 = vfmadd213ps_fma(auVar259,auVar174,auVar271);
            auVar272._8_4_ = 0x3def251a;
            auVar272._0_8_ = 0x3def251a3def251a;
            auVar272._12_4_ = 0x3def251a;
            auVar272._16_4_ = 0x3def251a;
            auVar272._20_4_ = 0x3def251a;
            auVar272._24_4_ = 0x3def251a;
            auVar272._28_4_ = 0x3def251a;
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar174,auVar272);
            auVar273._8_4_ = 0xbdfe5d4f;
            auVar273._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar273._12_4_ = 0xbdfe5d4f;
            auVar273._16_4_ = 0xbdfe5d4f;
            auVar273._20_4_ = 0xbdfe5d4f;
            auVar273._24_4_ = 0xbdfe5d4f;
            auVar273._28_4_ = 0xbdfe5d4f;
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar174,auVar273);
            auVar274._8_4_ = 0x3e11e9bf;
            auVar274._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar274._12_4_ = 0x3e11e9bf;
            auVar274._16_4_ = 0x3e11e9bf;
            auVar274._20_4_ = 0x3e11e9bf;
            auVar274._24_4_ = 0x3e11e9bf;
            auVar274._28_4_ = 0x3e11e9bf;
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar174,auVar274);
            auVar275._8_4_ = 0xbe2aae50;
            auVar275._0_8_ = 0xbe2aae50be2aae50;
            auVar275._12_4_ = 0xbe2aae50;
            auVar275._16_4_ = 0xbe2aae50;
            auVar275._20_4_ = 0xbe2aae50;
            auVar275._24_4_ = 0xbe2aae50;
            auVar275._28_4_ = 0xbe2aae50;
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar174,auVar275);
            auVar276._8_4_ = 0x3e4cceac;
            auVar276._0_8_ = 0x3e4cceac3e4cceac;
            auVar276._12_4_ = 0x3e4cceac;
            auVar276._16_4_ = 0x3e4cceac;
            auVar276._20_4_ = 0x3e4cceac;
            auVar276._24_4_ = 0x3e4cceac;
            auVar276._28_4_ = 0x3e4cceac;
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar174,auVar276);
            auVar277._8_4_ = 0xbe7ffffc;
            auVar277._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar277._12_4_ = 0xbe7ffffc;
            auVar277._16_4_ = 0xbe7ffffc;
            auVar277._20_4_ = 0xbe7ffffc;
            auVar277._24_4_ = 0xbe7ffffc;
            auVar277._28_4_ = 0xbe7ffffc;
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar174,auVar277);
            auVar278._8_4_ = 0x3eaaaaaa;
            auVar278._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar278._12_4_ = 0x3eaaaaaa;
            auVar278._16_4_ = 0x3eaaaaaa;
            auVar278._20_4_ = 0x3eaaaaaa;
            auVar278._24_4_ = 0x3eaaaaaa;
            auVar278._28_4_ = 0x3eaaaaaa;
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar174,auVar278);
            auVar260._0_4_ = auVar238._0_4_ * auVar174._0_4_ * auVar131._0_4_;
            auVar260._4_4_ = auVar238._4_4_ * auVar174._4_4_ * auVar131._4_4_;
            auVar260._8_4_ = auVar238._8_4_ * auVar174._8_4_ * auVar131._8_4_;
            auVar260._12_4_ = auVar238._12_4_ * auVar174._12_4_ * auVar131._12_4_;
            auVar260._16_4_ = auVar238._16_4_ * auVar174._16_4_ * 0.0;
            auVar260._20_4_ = auVar238._20_4_ * auVar174._20_4_ * 0.0;
            auVar260._24_4_ = auVar238._24_4_ * auVar174._24_4_ * 0.0;
            auVar260._28_4_ = 0;
            auVar90 = vcvtdq2ps_avx(auVar207);
            auVar131 = vfmadd231ps_fma(auVar260,auVar90,auVar315);
            auVar131 = vfmsub231ps_fma(ZEXT1632(auVar131),auVar331,auVar238);
            auVar269 = vcmpps_avx(ZEXT1632(auVar214),_DAT_005a85e0,2);
            auVar77 = vsubps_avx(ZEXT1632(auVar131),auVar174);
            auVar131 = vfmsub231ps_fma(auVar77,auVar356,auVar90);
            auVar261._8_4_ = 0xc0000000;
            auVar261._0_8_ = 0xc0000000c0000000;
            auVar261._12_4_ = 0xc0000000;
            auVar261._16_4_ = 0xc0000000;
            auVar261._20_4_ = 0xc0000000;
            auVar261._24_4_ = 0xc0000000;
            auVar261._28_4_ = 0xc0000000;
            auVar175._0_4_ = auVar131._0_4_ * -2.0;
            auVar175._4_4_ = auVar131._4_4_ * -2.0;
            auVar175._8_4_ = auVar131._8_4_ * -2.0;
            auVar175._12_4_ = auVar131._12_4_ * -2.0;
            auVar175._16_4_ = 0x80000000;
            auVar175._20_4_ = 0x80000000;
            auVar175._24_4_ = 0x80000000;
            auVar175._28_4_ = 0;
            auVar208._8_4_ = 0x7fffffff;
            auVar208._0_8_ = 0x7fffffff7fffffff;
            auVar208._12_4_ = 0x7fffffff;
            auVar208._16_4_ = 0x7fffffff;
            auVar208._20_4_ = 0x7fffffff;
            auVar208._24_4_ = 0x7fffffff;
            auVar208._28_4_ = 0x7fffffff;
            auVar269 = vblendvps_avx(auVar175,auVar208,auVar269);
            auVar176._8_4_ = 0x42b0c0a5;
            auVar176._0_8_ = 0x42b0c0a542b0c0a5;
            auVar176._12_4_ = 0x42b0c0a5;
            auVar176._16_4_ = 0x42b0c0a5;
            auVar176._20_4_ = 0x42b0c0a5;
            auVar176._24_4_ = 0x42b0c0a5;
            auVar176._28_4_ = 0x42b0c0a5;
            auVar269 = vminps_avx(auVar269,auVar176);
            auVar177._8_4_ = 0xc2b0c0a5;
            auVar177._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar177._12_4_ = 0xc2b0c0a5;
            auVar177._16_4_ = 0xc2b0c0a5;
            auVar177._20_4_ = 0xc2b0c0a5;
            auVar177._24_4_ = 0xc2b0c0a5;
            auVar177._28_4_ = 0xc2b0c0a5;
            auVar90 = vmaxps_avx(auVar269,auVar177);
            auVar178._8_4_ = 0x3fb8aa3b;
            auVar178._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar178._12_4_ = 0x3fb8aa3b;
            auVar178._16_4_ = 0x3fb8aa3b;
            auVar178._20_4_ = 0x3fb8aa3b;
            auVar178._24_4_ = 0x3fb8aa3b;
            auVar178._28_4_ = 0x3fb8aa3b;
            auVar131 = vfmadd213ps_fma(auVar178,auVar90,auVar331);
            auVar77 = vroundps_avx(ZEXT1632(auVar131),1);
            auVar269 = vcmpps_avx(ZEXT1632(auVar131),auVar77,1);
            auVar269 = vandps_avx(auVar350,auVar269);
            auVar269 = vsubps_avx(auVar77,auVar269);
            auVar131 = vfmsub231ps_fma(auVar90,auVar269,auVar356);
            auVar187 = vfnmsub231ps_fma(ZEXT1632(auVar131),auVar269,auVar315);
            auVar90 = ZEXT1632(auVar187);
            auVar20._28_4_ = auVar77._28_4_;
            auVar20._0_28_ =
                 ZEXT1628(CONCAT412(auVar187._12_4_ * auVar187._12_4_,
                                    CONCAT48(auVar187._8_4_ * auVar187._8_4_,
                                             CONCAT44(auVar187._4_4_ * auVar187._4_4_,
                                                      auVar187._0_4_ * auVar187._0_4_))));
            auVar131 = vfmadd213ps_fma(auVar369,auVar90,auVar362);
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar375);
            auVar279._8_4_ = 0x3d2aa9c1;
            auVar279._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar279._12_4_ = 0x3d2aa9c1;
            auVar279._16_4_ = 0x3d2aa9c1;
            auVar279._20_4_ = 0x3d2aa9c1;
            auVar279._24_4_ = 0x3d2aa9c1;
            auVar279._28_4_ = 0x3d2aa9c1;
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar279);
            auVar280._8_4_ = 0x3e2aaaaa;
            auVar280._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar280._12_4_ = 0x3e2aaaaa;
            auVar280._16_4_ = 0x3e2aaaaa;
            auVar280._20_4_ = 0x3e2aaaaa;
            auVar280._24_4_ = 0x3e2aaaaa;
            auVar280._28_4_ = 0x3e2aaaaa;
            auVar90 = ZEXT1632(auVar187);
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar280);
            auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar90,auVar331);
            auVar214 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar20,auVar90);
            auVar99._0_4_ = (int)auVar269._0_4_;
            auVar99._4_4_ = (int)auVar269._4_4_;
            auVar99._8_4_ = (int)auVar269._8_4_;
            auVar99._12_4_ = (int)auVar269._12_4_;
            auVar120._16_4_ = (int)auVar269._16_4_;
            auVar120._0_16_ = auVar99;
            auVar120._20_4_ = (int)auVar269._20_4_;
            auVar120._24_4_ = (int)auVar269._24_4_;
            auVar120._28_4_ = (int)auVar269._28_4_;
            auVar187 = vpslld_avx(auVar99,0x17);
            auVar131 = vpslld_avx(auVar120._16_16_,0x17);
            auVar131 = vpaddd_avx(auVar131,auVar288);
            auVar187 = vpaddd_avx(auVar187,auVar288);
            auVar121._16_16_ = auVar131;
            auVar121._0_16_ = auVar187;
            auVar179._0_4_ = auVar214._0_4_ + 1.0;
            auVar179._4_4_ = auVar214._4_4_ + 1.0;
            auVar179._8_4_ = auVar214._8_4_ + 1.0;
            auVar179._12_4_ = auVar214._12_4_ + 1.0;
            auVar179._16_4_ = 0x3f800000;
            auVar179._20_4_ = 0x3f800000;
            auVar179._24_4_ = 0x3f800000;
            auVar179._28_4_ = 0x3f800000;
            auVar131 = vfmadd213ps_fma(auVar121,auVar179,auVar350);
            auVar269 = vdivps_avx(auVar350,ZEXT1632(auVar131));
            auVar131 = vfnmadd213ps_fma(auVar269,auVar261,auVar344);
            auVar73 = ZEXT1628(auVar131);
            goto LAB_002eb646;
          case 6:
            puVar35 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar1 = *puVar35;
            auVar127._4_4_ = uVar1;
            auVar127._0_4_ = uVar1;
            auVar127._8_4_ = uVar1;
            auVar127._12_4_ = uVar1;
            auVar127._16_4_ = uVar1;
            auVar127._20_4_ = uVar1;
            auVar127._24_4_ = uVar1;
            auVar127._28_4_ = uVar1;
            uVar1 = puVar35[1];
            auVar183._4_4_ = uVar1;
            auVar183._0_4_ = uVar1;
            auVar183._8_4_ = uVar1;
            auVar183._12_4_ = uVar1;
            auVar183._16_4_ = uVar1;
            auVar183._20_4_ = uVar1;
            auVar183._24_4_ = uVar1;
            auVar183._28_4_ = uVar1;
            auVar131 = vfmadd231ps_fma(auVar183,auVar88,auVar127);
            auVar269 = vmaxps_avx(ZEXT1632(auVar131),_DAT_005a85e0);
            auVar184._8_4_ = 0x3f800000;
            auVar184._0_8_ = 0x3f8000003f800000;
            auVar184._12_4_ = 0x3f800000;
            auVar184._16_4_ = 0x3f800000;
            auVar184._20_4_ = 0x3f800000;
            auVar184._24_4_ = 0x3f800000;
            auVar184._28_4_ = 0x3f800000;
            auVar269 = vminps_avx(auVar269,auVar184);
            auVar73 = auVar269._0_28_;
LAB_002eb646:
            auVar88._4_4_ = auVar73._4_4_ * fVar129;
            auVar88._0_4_ = auVar73._0_4_ * fVar94;
            auVar88._8_4_ = auVar73._8_4_ * auVar88._8_4_;
            auVar88._12_4_ = auVar73._12_4_ * auVar88._12_4_;
            auVar88._16_4_ = auVar73._16_4_ * auVar88._16_4_;
            auVar88._20_4_ = auVar73._20_4_ * auVar88._20_4_;
            auVar88._24_4_ = auVar73._24_4_ * auVar88._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + local_2c0 * 4) = auVar88;
          uVar30 = local_300 + 1;
          lVar38 = local_2c8 + 8;
          lVar34 = local_2d0 + 8;
          lVar36 = local_2d8 + 8;
          lVar39 = local_2e0 + 8;
          lVar41 = local_2e8 + 8;
          lVar54 = local_2f0 + 8;
          lVar56 = local_2f8 + 8;
          local_308 = local_308 + 8;
        } while (uVar30 != local_220);
      }
      auVar187 = local_278;
      auVar131 = local_288;
      local_238 = (ulong)(int)uVar28;
      uVar30 = local_238 & 0xfffffffffffffff8;
      uVar27 = uVar28 >> 2 & 1;
      local_288._4_4_ = 0;
      local_288._0_4_ = uVar27;
      if ((uVar28 >> 2 & 1) != 0) {
        local_288._8_8_ = auVar131._8_8_;
        if (pvVar15 == (void *)0x0) {
          auVar131 = ZEXT816(0) << 0x40;
        }
        else {
          auVar131 = *(undefined1 (*) [16])((long)pvVar15 + uVar30 * 4);
        }
        lVar38 = (long)(this->weight_data_tm).w * (this->weight_data_tm).elemsize;
        pvVar16 = (this->weight_data_tm).data;
        local_2b8 = (float)uVar30;
        uStack_2b4 = (undefined4)(uVar30 >> 0x20);
        pauVar32 = (undefined1 (*) [16])(lVar38 * uVar30 + (long)pvVar16);
        pauVar57 = (undefined1 (*) [16])((uVar30 | 1) * lVar38 + (long)pvVar16);
        pauVar51 = (undefined1 (*) [16])((uVar30 | 2) * lVar38 + (long)pvVar16);
        pauVar53 = (undefined1 (*) [16])(lVar38 * (uVar30 | 3) + (long)pvVar16);
        pauVar33 = (undefined1 (*) [32])local_3c8._0_8_;
        if ((int)uVar50 < 8) {
          uVar27 = 0;
          local_1b8 = SUB6432(ZEXT864(0),0);
          local_1f8 = SUB6432(ZEXT864(0),0);
          local_1d8 = SUB6432(ZEXT864(0),0);
          local_198 = SUB6432(ZEXT864(0),0);
        }
        else {
          uVar27 = uVar50 & 0xfffffff8;
          auVar285 = ZEXT864(0);
          iVar37 = 7;
          auVar185 = ZEXT864(0);
          auVar210 = ZEXT864(0);
          auVar128 = ZEXT864(0);
          do {
            auVar269 = *pauVar33;
            auVar214 = vlddqu_avx(*pauVar32);
            auVar90 = vcvtph2ps_f16c(auVar214);
            auVar214 = vlddqu_avx(*pauVar57);
            auVar77 = vcvtph2ps_f16c(auVar214);
            auVar214 = vlddqu_avx(*pauVar51);
            auVar88 = vcvtph2ps_f16c(auVar214);
            auVar214 = vlddqu_avx(*pauVar53);
            auVar127 = vcvtph2ps_f16c(auVar214);
            auVar214 = vfmadd231ps_fma(auVar128._0_32_,auVar269,auVar90);
            auVar128 = ZEXT1664(auVar214);
            local_1b8 = ZEXT1632(auVar214);
            auVar214 = vfmadd231ps_fma(auVar210._0_32_,auVar269,auVar77);
            auVar210 = ZEXT1664(auVar214);
            local_1f8 = ZEXT1632(auVar214);
            auVar214 = vfmadd231ps_fma(auVar185._0_32_,auVar269,auVar88);
            auVar185 = ZEXT1664(auVar214);
            local_1d8 = ZEXT1632(auVar214);
            auVar214 = vfmadd231ps_fma(auVar285._0_32_,auVar269,auVar127);
            auVar285 = ZEXT1664(auVar214);
            local_198 = ZEXT1632(auVar214);
            pauVar33 = pauVar33 + 1;
            pauVar32 = pauVar32 + 1;
            pauVar57 = pauVar57 + 1;
            pauVar51 = pauVar51 + 1;
            pauVar53 = pauVar53 + 1;
            iVar37 = iVar37 + 8;
          } while (iVar37 < (int)uVar50);
        }
        local_358 = ZEXT816(0) << 0x40;
        if ((int)(uVar27 | 3) < (int)uVar50) {
          auVar285 = ZEXT864(0);
          lVar38 = 0;
          auVar128 = ZEXT864(0);
          local_378 = ZEXT816(0);
          pauVar55 = pauVar33;
          uVar40 = uVar27;
          do {
            auVar214._8_8_ = 0;
            auVar214._0_8_ = *(ulong *)(*pauVar32 + lVar38);
            auVar99 = vcvtph2ps_f16c(auVar214);
            auVar9._8_8_ = 0;
            auVar9._0_8_ = *(ulong *)(*pauVar57 + lVar38);
            auVar265 = vcvtph2ps_f16c(auVar9);
            auVar10._8_8_ = 0;
            auVar10._0_8_ = *(ulong *)(*pauVar51 + lVar38);
            auVar288 = vcvtph2ps_f16c(auVar10);
            auVar214 = *(undefined1 (*) [16])(*pauVar33 + lVar38 * 2);
            auVar11._8_8_ = 0;
            auVar11._0_8_ = *(ulong *)(*pauVar53 + lVar38);
            auVar66 = vcvtph2ps_f16c(auVar11);
            local_358 = vfmadd231ps_fma(local_358,auVar214,auVar99);
            local_378 = vfmadd231ps_fma(local_378,auVar214,auVar265);
            local_368 = vfmadd231ps_fma(auVar128._0_16_,auVar214,auVar288);
            auVar128 = ZEXT1664(local_368);
            local_348 = vfmadd231ps_fma(auVar285._0_16_,auVar214,auVar66);
            auVar285 = ZEXT1664(local_348);
            pauVar55 = (undefined1 (*) [32])(*pauVar55 + 0x10);
            uVar27 = uVar40 + 4;
            iVar37 = uVar40 + 7;
            lVar38 = lVar38 + 8;
            uVar40 = uVar27;
          } while (iVar37 < (int)uVar50);
          pauVar53 = (undefined1 (*) [16])(*pauVar53 + lVar38);
          pauVar51 = (undefined1 (*) [16])(*pauVar51 + lVar38);
          pauVar57 = (undefined1 (*) [16])(*pauVar57 + lVar38);
          pauVar32 = (undefined1 (*) [16])(*pauVar32 + lVar38);
          pauVar33 = pauVar55;
        }
        else {
          local_378 = ZEXT816(0);
          local_368 = SUB6416(ZEXT864(0),0);
          local_348 = SUB6416(ZEXT864(0),0);
        }
        local_278._4_4_ = 0;
        local_278._0_4_ = uVar50 - uVar27;
        local_278._8_8_ = auVar187._8_8_;
        if (uVar50 - uVar27 != 0 && (int)uVar27 <= (int)uVar50) {
          lVar38 = 0;
          do {
            local_2a8._0_16_ = auVar131;
            local_318 = ZEXT416(*(uint *)(*pauVar33 + lVar38 * 4));
            fVar94 = float16_to_float32(*(unsigned_short *)(*pauVar32 + lVar38 * 2));
            auVar269 = _local_218;
            local_218._4_4_ = extraout_XMM0_Db_06;
            local_218._0_4_ = fVar94;
            fStack_210 = (float)extraout_XMM0_Dc_05;
            _fStack_208 = auVar269._16_16_;
            fStack_20c = (float)extraout_XMM0_Dd_05;
            _local_328 = ZEXT416(*(uint *)(*pauVar33 + lVar38 * 4));
            local_338._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar57 + lVar38 * 2));
            local_338._4_4_ = extraout_XMM0_Db_07;
            local_338._8_4_ = extraout_XMM0_Dc_06;
            local_338._12_4_ = extraout_XMM0_Dd_06;
            local_248 = ZEXT416(*(uint *)(*pauVar33 + lVar38 * 4));
            local_258._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar51 + lVar38 * 2));
            local_258._4_4_ = extraout_XMM0_Db_08;
            local_258._8_4_ = extraout_XMM0_Dc_07;
            local_258._12_4_ = extraout_XMM0_Dd_07;
            local_268 = ZEXT416(*(uint *)(*pauVar33 + lVar38 * 4));
            auVar128._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar53 + lVar38 * 2));
            auVar128._4_60_ = extraout_var_00;
            auVar131 = vinsertps_avx(_local_218,ZEXT416((uint)local_338._0_4_),0x10);
            auVar131 = vinsertps_avx(auVar131,ZEXT416((uint)local_258._0_4_),0x20);
            auVar131 = vinsertps_avx(auVar131,auVar128._0_16_,0x30);
            auVar187 = vinsertps_avx(local_318,ZEXT416((uint)local_328._0_4_),0x10);
            auVar187 = vinsertps_avx(auVar187,ZEXT416((uint)local_248._0_4_),0x20);
            auVar187 = vinsertps_avx(auVar187,ZEXT416((uint)local_268._0_4_),0x30);
            auVar131 = vfmadd231ps_fma(local_2a8._0_16_,auVar131,auVar187);
            lVar38 = lVar38 + 1;
          } while (local_278._0_4_ != (int)lVar38);
        }
        auVar269 = vhaddps_avx(local_1b8,local_1f8);
        auVar90 = vhaddps_avx(local_1d8,local_198);
        auVar269 = vhaddps_avx(auVar269,auVar90);
        auVar214 = vunpcklps_avx(local_358,local_378);
        auVar99 = vunpcklps_avx(local_368,local_348);
        auVar265 = vunpckhps_avx(local_358,local_378);
        auVar288 = vunpckhps_avx(local_368,local_348);
        auVar187 = vmovlhps_avx(auVar214,auVar99);
        auVar99 = vunpckhpd_avx(auVar214,auVar99);
        auVar214 = vmovlhps_avx(auVar265,auVar288);
        auVar265 = vunpckhpd_avx(auVar265,auVar288);
        auVar67._0_4_ =
             auVar99._0_4_ + auVar187._0_4_ + auVar214._0_4_ + auVar265._0_4_ +
             auVar131._0_4_ + auVar269._0_4_ + auVar269._16_4_;
        auVar67._4_4_ =
             auVar99._4_4_ + auVar187._4_4_ + auVar214._4_4_ + auVar265._4_4_ +
             auVar131._4_4_ + auVar269._4_4_ + auVar269._20_4_;
        auVar67._8_4_ =
             auVar99._8_4_ + auVar187._8_4_ + auVar214._8_4_ + auVar265._8_4_ +
             auVar131._8_4_ + auVar269._8_4_ + auVar269._24_4_;
        auVar67._12_4_ =
             auVar99._12_4_ + auVar187._12_4_ + auVar214._12_4_ + auVar265._12_4_ +
             auVar131._12_4_ + auVar269._12_4_ + auVar269._28_4_;
        switch(iVar13) {
        case 1:
          auVar67 = vmaxps_avx(auVar67,ZEXT816(0) << 0x20);
          break;
        case 2:
          auVar131 = vmaxps_avx(auVar67,ZEXT816(0) << 0x20);
          auVar187 = vminps_avx(auVar67,ZEXT816(0) << 0x20);
          uVar1 = *(this->super_InnerProduct).activation_params.data;
          auVar71._4_4_ = uVar1;
          auVar71._0_4_ = uVar1;
          auVar71._8_4_ = uVar1;
          auVar71._12_4_ = uVar1;
          auVar67 = vfmadd213ps_fma(auVar71,auVar187,auVar131);
          break;
        case 3:
          puVar35 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar1 = *puVar35;
          auVar104._4_4_ = uVar1;
          auVar104._0_4_ = uVar1;
          auVar104._8_4_ = uVar1;
          auVar104._12_4_ = uVar1;
          uVar1 = puVar35[1];
          auVar154._4_4_ = uVar1;
          auVar154._0_4_ = uVar1;
          auVar154._8_4_ = uVar1;
          auVar154._12_4_ = uVar1;
          auVar131 = vmaxps_avx(auVar67,auVar104);
          auVar67 = vminps_avx(auVar131,auVar154);
          break;
        case 4:
          uVar30 = CONCAT44(auVar67._4_4_,auVar67._0_4_);
          auVar68._0_8_ = uVar30 ^ 0x8000000080000000;
          auVar68._8_4_ = -auVar67._8_4_;
          auVar68._12_4_ = -auVar67._12_4_;
          auVar105._8_4_ = 0x42b0c0a5;
          auVar105._0_8_ = 0x42b0c0a542b0c0a5;
          auVar105._12_4_ = 0x42b0c0a5;
          auVar131 = vminps_avx(auVar68,auVar105);
          auVar106._8_4_ = 0xc2b0c0a5;
          auVar106._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar106._12_4_ = 0xc2b0c0a5;
          auVar214 = vmaxps_avx(auVar131,auVar106);
          auVar69._8_4_ = 0x3fb8aa3b;
          auVar69._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar69._12_4_ = 0x3fb8aa3b;
          auVar155._8_4_ = 0x3f000000;
          auVar155._0_8_ = 0x3f0000003f000000;
          auVar155._12_4_ = 0x3f000000;
          auVar131 = vfmadd213ps_fma(auVar69,auVar214,auVar155);
          auVar200._0_4_ = (int)auVar131._0_4_;
          auVar200._4_4_ = (int)auVar131._4_4_;
          auVar200._8_4_ = (int)auVar131._8_4_;
          auVar200._12_4_ = (int)auVar131._12_4_;
          auVar187 = vcvtdq2ps_avx(auVar200);
          auVar131 = vcmpps_avx(auVar131,auVar187,1);
          auVar70._8_4_ = 0x3f800000;
          auVar70._0_8_ = 0x3f8000003f800000;
          auVar70._12_4_ = 0x3f800000;
          auVar131 = vandps_avx(auVar131,auVar70);
          auVar131 = vsubps_avx(auVar187,auVar131);
          auVar230._8_4_ = 0x3f318000;
          auVar230._0_8_ = 0x3f3180003f318000;
          auVar230._12_4_ = 0x3f318000;
          auVar187 = vfmsub213ps_fma(auVar230,auVar131,auVar214);
          auVar107._8_4_ = 0x395e8083;
          auVar107._0_8_ = 0x395e8083395e8083;
          auVar107._12_4_ = 0x395e8083;
          auVar214 = vfmsub213ps_fma(auVar107,auVar131,auVar187);
          auVar231._0_4_ = auVar214._0_4_ * auVar214._0_4_;
          auVar231._4_4_ = auVar214._4_4_ * auVar214._4_4_;
          auVar231._8_4_ = auVar214._8_4_ * auVar214._8_4_;
          auVar231._12_4_ = auVar214._12_4_ * auVar214._12_4_;
          auVar244._8_4_ = 0x3ab743ce;
          auVar244._0_8_ = 0x3ab743ce3ab743ce;
          auVar244._12_4_ = 0x3ab743ce;
          auVar267._8_4_ = 0x39506967;
          auVar267._0_8_ = 0x3950696739506967;
          auVar267._12_4_ = 0x39506967;
          auVar187 = vfmadd213ps_fma(auVar267,auVar214,auVar244);
          auVar245._8_4_ = 0x3c088908;
          auVar245._0_8_ = 0x3c0889083c088908;
          auVar245._12_4_ = 0x3c088908;
          auVar187 = vfmadd231ps_fma(auVar245,auVar214,auVar187);
          auVar268._8_4_ = 0x3d2aa9c1;
          auVar268._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar268._12_4_ = 0x3d2aa9c1;
          auVar187 = vfmadd231ps_fma(auVar268,auVar214,auVar187);
          auVar246._8_4_ = 0x3e2aaaaa;
          auVar246._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar246._12_4_ = 0x3e2aaaaa;
          auVar187 = vfmadd231ps_fma(auVar246,auVar214,auVar187);
          auVar187 = vfmadd213ps_fma(auVar187,auVar214,auVar155);
          auVar187 = vfmadd213ps_fma(auVar187,auVar231,auVar214);
          auVar108._0_4_ = auVar187._0_4_ + 1.0;
          auVar108._4_4_ = auVar187._4_4_ + 1.0;
          auVar108._8_4_ = auVar187._8_4_ + 1.0;
          auVar108._12_4_ = auVar187._12_4_ + 1.0;
          auVar156._0_4_ = (int)auVar131._0_4_;
          auVar156._4_4_ = (int)auVar131._4_4_;
          auVar156._8_4_ = (int)auVar131._8_4_;
          auVar156._12_4_ = (int)auVar131._12_4_;
          auVar131 = vpslld_avx(auVar156,0x17);
          auVar131 = vpaddd_avx(auVar131,auVar70);
          auVar131 = vfmadd213ps_fma(auVar131,auVar108,auVar70);
          auVar67 = vdivps_avx(auVar70,auVar131);
          break;
        case 5:
          auVar100._8_4_ = 0x42b0c0a5;
          auVar100._0_8_ = 0x42b0c0a542b0c0a5;
          auVar100._12_4_ = 0x42b0c0a5;
          auVar131 = vminps_avx(auVar67,auVar100);
          auVar142._8_4_ = 0xc2b0c0a5;
          auVar142._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar142._12_4_ = 0xc2b0c0a5;
          auVar214 = vmaxps_avx(auVar131,auVar142);
          auVar243._8_4_ = 0x3fb8aa3b;
          auVar243._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar243._12_4_ = 0x3fb8aa3b;
          auVar289._8_4_ = 0x3f000000;
          auVar289._0_8_ = 0x3f0000003f000000;
          auVar289._12_4_ = 0x3f000000;
          auVar131 = vfmadd213ps_fma(auVar243,auVar214,auVar289);
          auVar198._0_4_ = (int)auVar131._0_4_;
          auVar198._4_4_ = (int)auVar131._4_4_;
          auVar198._8_4_ = (int)auVar131._8_4_;
          auVar198._12_4_ = (int)auVar131._12_4_;
          auVar187 = vcvtdq2ps_avx(auVar198);
          auVar131 = vcmpps_avx(auVar131,auVar187,1);
          auVar266._8_4_ = 0x3f800000;
          auVar266._0_8_ = 0x3f8000003f800000;
          auVar266._12_4_ = 0x3f800000;
          auVar131 = vandps_avx(auVar131,auVar266);
          auVar131 = vsubps_avx(auVar187,auVar131);
          auVar199._8_4_ = 0x3f318000;
          auVar199._0_8_ = 0x3f3180003f318000;
          auVar199._12_4_ = 0x3f318000;
          auVar187 = vfmsub231ps_fma(auVar214,auVar131,auVar199);
          auVar310._8_4_ = 0xb95e8083;
          auVar310._0_8_ = 0xb95e8083b95e8083;
          auVar310._12_4_ = 0xb95e8083;
          auVar214 = vfnmsub231ps_fma(auVar187,auVar131,auVar310);
          auVar371._0_4_ = auVar214._0_4_ * auVar214._0_4_;
          auVar371._4_4_ = auVar214._4_4_ * auVar214._4_4_;
          auVar371._8_4_ = auVar214._8_4_ * auVar214._8_4_;
          auVar371._12_4_ = auVar214._12_4_ * auVar214._12_4_;
          auVar143._8_4_ = 0x3ab743ce;
          auVar143._0_8_ = 0x3ab743ce3ab743ce;
          auVar143._12_4_ = 0x3ab743ce;
          auVar101._8_4_ = 0x39506967;
          auVar101._0_8_ = 0x3950696739506967;
          auVar101._12_4_ = 0x39506967;
          auVar187 = vfmadd213ps_fma(auVar101,auVar214,auVar143);
          auVar341._8_4_ = 0x3c088908;
          auVar341._0_8_ = 0x3c0889083c088908;
          auVar341._12_4_ = 0x3c088908;
          auVar187 = vfmadd213ps_fma(auVar187,auVar214,auVar341);
          auVar347._8_4_ = 0x3d2aa9c1;
          auVar347._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar347._12_4_ = 0x3d2aa9c1;
          auVar187 = vfmadd213ps_fma(auVar187,auVar214,auVar347);
          auVar353._8_4_ = 0x3e2aaaaa;
          auVar353._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar353._12_4_ = 0x3e2aaaaa;
          auVar187 = vfmadd213ps_fma(auVar187,auVar214,auVar353);
          auVar187 = vfmadd213ps_fma(auVar187,auVar214,auVar289);
          auVar187 = vfmadd213ps_fma(auVar187,auVar371,auVar214);
          auVar219._0_4_ = auVar187._0_4_ + 1.0;
          auVar219._4_4_ = auVar187._4_4_ + 1.0;
          auVar219._8_4_ = auVar187._8_4_ + 1.0;
          auVar219._12_4_ = auVar187._12_4_ + 1.0;
          auVar364._0_4_ = (int)auVar131._0_4_;
          auVar364._4_4_ = (int)auVar131._4_4_;
          auVar364._8_4_ = (int)auVar131._8_4_;
          auVar364._12_4_ = (int)auVar131._12_4_;
          auVar131 = vpslld_avx(auVar364,0x17);
          auVar131 = vpaddd_avx(auVar131,auVar266);
          auVar131 = vfmadd213ps_fma(auVar131,auVar219,auVar266);
          auVar187 = vcmpps_avx(auVar131,ZEXT816(0) << 0x40,2);
          auVar220._8_4_ = 0x800000;
          auVar220._0_8_ = 0x80000000800000;
          auVar220._12_4_ = 0x800000;
          auVar131 = vmaxps_avx(auVar131,auVar220);
          auVar214 = vpsrld_avx(auVar131,0x17);
          auVar372._8_4_ = 0x807fffff;
          auVar372._0_8_ = 0x807fffff807fffff;
          auVar372._12_4_ = 0x807fffff;
          auVar131 = vandps_avx(auVar372,auVar131);
          auVar99 = vorps_avx(auVar131,auVar289);
          auVar373._8_4_ = 0xffffff82;
          auVar373._0_8_ = 0xffffff82ffffff82;
          auVar373._12_4_ = 0xffffff82;
          auVar265 = vpaddd_avx(auVar214,auVar373);
          auVar365._8_4_ = 0x3f3504f3;
          auVar365._0_8_ = 0x3f3504f33f3504f3;
          auVar365._12_4_ = 0x3f3504f3;
          auVar214 = vcmpps_avx(auVar99,auVar365,1);
          auVar131 = vandps_avx(auVar214,auVar99);
          auVar366._0_4_ = auVar99._0_4_ + -1.0 + auVar131._0_4_;
          auVar366._4_4_ = auVar99._4_4_ + -1.0 + auVar131._4_4_;
          auVar366._8_4_ = auVar99._8_4_ + -1.0 + auVar131._8_4_;
          auVar366._12_4_ = auVar99._12_4_ + -1.0 + auVar131._12_4_;
          auVar99 = vcvtdq2ps_avx(auVar265);
          auVar131 = vandps_avx(auVar214,auVar266);
          auVar131 = vsubps_avx(auVar99,auVar131);
          auVar144._8_4_ = 0xbdebd1b8;
          auVar144._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar144._12_4_ = 0xbdebd1b8;
          auVar221._8_4_ = 0x3d9021bb;
          auVar221._0_8_ = 0x3d9021bb3d9021bb;
          auVar221._12_4_ = 0x3d9021bb;
          auVar214 = vfmadd213ps_fma(auVar221,auVar366,auVar144);
          auVar145._8_4_ = 0x3def251a;
          auVar145._0_8_ = 0x3def251a3def251a;
          auVar145._12_4_ = 0x3def251a;
          auVar214 = vfmadd231ps_fma(auVar145,auVar366,auVar214);
          auVar222._8_4_ = 0xbdfe5d4f;
          auVar222._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar222._12_4_ = 0xbdfe5d4f;
          auVar214 = vfmadd231ps_fma(auVar222,auVar366,auVar214);
          auVar146._8_4_ = 0x3e11e9bf;
          auVar146._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar146._12_4_ = 0x3e11e9bf;
          auVar214 = vfmadd231ps_fma(auVar146,auVar366,auVar214);
          auVar223._8_4_ = 0xbe2aae50;
          auVar223._0_8_ = 0xbe2aae50be2aae50;
          auVar223._12_4_ = 0xbe2aae50;
          auVar214 = vfmadd231ps_fma(auVar223,auVar366,auVar214);
          auVar147._8_4_ = 0x3e4cceac;
          auVar147._0_8_ = 0x3e4cceac3e4cceac;
          auVar147._12_4_ = 0x3e4cceac;
          auVar214 = vfmadd231ps_fma(auVar147,auVar366,auVar214);
          auVar224._8_4_ = 0xbe7ffffc;
          auVar224._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar224._12_4_ = 0xbe7ffffc;
          auVar214 = vfmadd231ps_fma(auVar224,auVar366,auVar214);
          auVar148._8_4_ = 0x3eaaaaaa;
          auVar148._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar148._12_4_ = 0x3eaaaaaa;
          auVar214 = vfmadd231ps_fma(auVar148,auVar366,auVar214);
          auVar225._0_4_ = auVar366._0_4_ * auVar366._0_4_;
          auVar225._4_4_ = auVar366._4_4_ * auVar366._4_4_;
          auVar225._8_4_ = auVar366._8_4_ * auVar366._8_4_;
          auVar225._12_4_ = auVar366._12_4_ * auVar366._12_4_;
          auVar149._0_4_ = auVar366._0_4_ * auVar225._0_4_ * auVar214._0_4_;
          auVar149._4_4_ = auVar366._4_4_ * auVar225._4_4_ * auVar214._4_4_;
          auVar149._8_4_ = auVar366._8_4_ * auVar225._8_4_ * auVar214._8_4_;
          auVar149._12_4_ = auVar366._12_4_ * auVar225._12_4_ * auVar214._12_4_;
          auVar214 = vfmadd231ps_fma(auVar149,auVar131,auVar310);
          auVar214 = vfmsub231ps_fma(auVar214,auVar289,auVar225);
          auVar214 = vsubps_avx(auVar214,auVar366);
          auVar131 = vfnmadd231ps_fma(auVar214,auVar199,auVar131);
          auVar150._0_4_ = auVar131._0_4_ + auVar131._0_4_;
          auVar150._4_4_ = auVar131._4_4_ + auVar131._4_4_;
          auVar150._8_4_ = auVar131._8_4_ + auVar131._8_4_;
          auVar150._12_4_ = auVar131._12_4_ + auVar131._12_4_;
          auVar226._8_4_ = 0x7fffffff;
          auVar226._0_8_ = 0x7fffffff7fffffff;
          auVar226._12_4_ = 0x7fffffff;
          auVar131 = vblendvps_avx(auVar150,auVar226,auVar187);
          auVar227._8_4_ = 0x42b0c0a5;
          auVar227._0_8_ = 0x42b0c0a542b0c0a5;
          auVar227._12_4_ = 0x42b0c0a5;
          auVar131 = vminps_avx(auVar131,auVar227);
          auVar228._8_4_ = 0xc2b0c0a5;
          auVar228._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar228._12_4_ = 0xc2b0c0a5;
          auVar214 = vmaxps_avx(auVar131,auVar228);
          auVar131 = vfmadd213ps_fma(auVar243,auVar214,auVar289);
          auVar229._0_4_ = (int)auVar131._0_4_;
          auVar229._4_4_ = (int)auVar131._4_4_;
          auVar229._8_4_ = (int)auVar131._8_4_;
          auVar229._12_4_ = (int)auVar131._12_4_;
          auVar187 = vcvtdq2ps_avx(auVar229);
          auVar131 = vcmpps_avx(auVar131,auVar187,1);
          auVar131 = vandps_avx(auVar131,auVar266);
          auVar131 = vsubps_avx(auVar187,auVar131);
          auVar187 = vfmsub213ps_fma(auVar199,auVar131,auVar214);
          auVar214 = vfnmsub231ps_fma(auVar187,auVar131,auVar310);
          auVar151._8_4_ = 0x3ab743ce;
          auVar151._0_8_ = 0x3ab743ce3ab743ce;
          auVar151._12_4_ = 0x3ab743ce;
          auVar187 = vfmadd213ps_fma(auVar101,auVar214,auVar151);
          auVar187 = vfmadd213ps_fma(auVar187,auVar214,auVar341);
          auVar187 = vfmadd213ps_fma(auVar187,auVar214,auVar347);
          auVar187 = vfmadd213ps_fma(auVar187,auVar214,auVar353);
          auVar187 = vfmadd213ps_fma(auVar187,auVar214,auVar289);
          auVar152._0_4_ = auVar214._0_4_ * auVar214._0_4_;
          auVar152._4_4_ = auVar214._4_4_ * auVar214._4_4_;
          auVar152._8_4_ = auVar214._8_4_ * auVar214._8_4_;
          auVar152._12_4_ = auVar214._12_4_ * auVar214._12_4_;
          auVar187 = vfmadd213ps_fma(auVar187,auVar152,auVar214);
          auVar102._0_4_ = auVar187._0_4_ + 1.0;
          auVar102._4_4_ = auVar187._4_4_ + 1.0;
          auVar102._8_4_ = auVar187._8_4_ + 1.0;
          auVar102._12_4_ = auVar187._12_4_ + 1.0;
          auVar153._0_4_ = (int)auVar131._0_4_;
          auVar153._4_4_ = (int)auVar131._4_4_;
          auVar153._8_4_ = (int)auVar131._8_4_;
          auVar153._12_4_ = (int)auVar131._12_4_;
          auVar131 = vpslld_avx(auVar153,0x17);
          auVar131 = vpaddd_avx(auVar131,auVar266);
          auVar131 = vfmadd213ps_fma(auVar131,auVar102,auVar266);
          auVar103._8_4_ = 0x40000000;
          auVar103._0_8_ = 0x4000000040000000;
          auVar103._12_4_ = 0x40000000;
          auVar131 = vdivps_avx(auVar103,auVar131);
          auVar67 = vfmsub231ps_fma(auVar67,auVar67,auVar131);
          break;
        case 6:
          puVar35 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar1 = *puVar35;
          auVar109._4_4_ = uVar1;
          auVar109._0_4_ = uVar1;
          auVar109._8_4_ = uVar1;
          auVar109._12_4_ = uVar1;
          uVar1 = puVar35[1];
          auVar157._4_4_ = uVar1;
          auVar157._0_4_ = uVar1;
          auVar157._8_4_ = uVar1;
          auVar157._12_4_ = uVar1;
          auVar131 = vfmadd231ps_fma(auVar157,auVar67,auVar109);
          auVar131 = vmaxps_avx(auVar131,ZEXT416(0) << 0x20);
          auVar158._8_4_ = 0x3f800000;
          auVar158._0_8_ = 0x3f8000003f800000;
          auVar158._12_4_ = 0x3f800000;
          auVar131 = vminps_avx(auVar131,auVar158);
          auVar67._0_4_ = auVar131._0_4_ * auVar67._0_4_;
          auVar67._4_4_ = auVar131._4_4_ * auVar67._4_4_;
          auVar67._8_4_ = auVar131._8_4_ * auVar67._8_4_;
          auVar67._12_4_ = auVar131._12_4_ * auVar67._12_4_;
        }
        uVar30 = CONCAT44(uStack_2b4,local_2b8);
        *(undefined1 (*) [16])((long)top_blob->data + uVar30 * 4) = auVar67;
        uVar27 = local_288._0_4_;
        auVar131 = local_288;
      }
      local_288 = auVar131;
      iVar29 = (int)uVar30 + uVar27 * 4;
      iVar37 = 0;
      if ((int)uVar28 <= iVar29) goto LAB_002ec1a0;
      local_338._0_4_ = uVar50 & 0xfffffff8;
      uVar30 = (ulong)iVar29;
      do {
        auVar285 = ZEXT1664(ZEXT816(0) << 0x40);
        if (pvVar15 != (void *)0x0) {
          auVar285 = ZEXT464(*(uint *)((long)pvVar15 + uVar30 * 4));
        }
        fVar94 = auVar285._0_4_;
        pauVar32 = (undefined1 (*) [16])
                   ((long)(this->weight_data_tm).w * uVar30 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        pauVar33 = (undefined1 (*) [32])local_3c8._0_8_;
        if ((int)uVar50 < 8) {
          uVar28 = 0;
          _local_218 = SUB6432(ZEXT864(0),0);
        }
        else {
          auVar128 = ZEXT864(0);
          iVar37 = 7;
          do {
            auVar131 = vlddqu_avx(*pauVar32);
            auVar269 = vcvtph2ps_f16c(auVar131);
            auVar131 = vfmadd231ps_fma(auVar128._0_32_,auVar269,*pauVar33);
            auVar128 = ZEXT1664(auVar131);
            _local_218 = ZEXT1632(auVar131);
            pauVar33 = pauVar33 + 1;
            pauVar32 = pauVar32 + 1;
            iVar37 = iVar37 + 8;
          } while (iVar37 < (int)uVar50);
          uVar28 = local_338._0_4_;
        }
        _local_328 = ZEXT816(0) << 0x40;
        uVar27 = uVar28 | 3;
        while ((int)uVar27 < (int)uVar50) {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = *(ulong *)*pauVar32;
          auVar131 = vcvtph2ps_f16c(auVar12);
          _local_328 = vfmadd231ps_fma(_local_328,auVar131,*(undefined1 (*) [16])*pauVar33);
          pauVar33 = (undefined1 (*) [32])(*pauVar33 + 0x10);
          pauVar32 = (undefined1 (*) [16])(*pauVar32 + 8);
          uVar27 = uVar28 + 7;
          uVar28 = uVar28 + 4;
        }
        if ((int)uVar28 < (int)uVar50) {
          lVar38 = 0;
          do {
            local_2a8._0_4_ = auVar285._0_4_;
            local_318._0_4_ = *(undefined4 *)(*pauVar33 + lVar38 * 4);
            auVar185._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar32 + lVar38 * 2));
            auVar185._4_60_ = extraout_var_01;
            auVar131 = vfmadd231ss_fma(ZEXT416((uint)local_2a8._0_4_),auVar185._0_16_,
                                       ZEXT416((uint)local_318._0_4_));
            fVar94 = auVar131._0_4_;
            auVar285 = ZEXT1664(auVar131);
            lVar38 = lVar38 + 1;
          } while (uVar50 - uVar28 != (int)lVar38);
        }
        auVar72._0_4_ = (float)local_218._0_4_ + (float)local_328._0_4_ + fStack_208;
        auVar72._4_4_ = (float)local_218._4_4_ + (float)local_328._4_4_ + fStack_204;
        auVar72._8_4_ = fStack_210 + fStack_320 + fStack_200;
        auVar72._12_4_ = fStack_20c + fStack_31c + fStack_1fc;
        auVar131 = vhaddps_avx(auVar72,auVar72);
        auVar131 = vhaddps_avx(auVar131,auVar131);
        fVar94 = auVar131._0_4_ + fVar94;
        auVar131 = ZEXT416((uint)fVar94);
        fVar129 = fVar94;
        switch(iVar13) {
        case 1:
          auVar131 = vmaxss_avx(auVar131,ZEXT416(0));
          fVar129 = auVar131._0_4_;
          break;
        case 2:
          auVar131 = vcmpss_avx(ZEXT816(0) << 0x20,auVar131,1);
          auVar160._8_4_ = 0x3f800000;
          auVar160._0_8_ = 0x3f8000003f800000;
          auVar160._12_4_ = 0x3f800000;
          auVar131 = vblendvps_avx(ZEXT416(*(this->super_InnerProduct).activation_params.data),
                                   auVar160,auVar131);
          fVar129 = auVar131._0_4_ * fVar94;
          break;
        case 3:
          puVar18 = (uint *)(this->super_InnerProduct).activation_params.data;
          fVar94 = (float)puVar18[1];
          auVar131 = vmaxss_avx(auVar131,ZEXT416(*puVar18));
          fVar129 = auVar131._0_4_;
          if (fVar94 < auVar131._0_4_) {
            fVar129 = fVar94;
          }
          break;
        case 4:
          auVar131 = vminss_avx(auVar131,ZEXT416(0x42b0c0a5));
          auVar110._0_8_ = auVar131._0_8_ ^ 0x8000000080000000;
          auVar110._8_4_ = auVar131._8_4_ ^ 0x80000000;
          auVar110._12_4_ = auVar131._12_4_ ^ 0x80000000;
          auVar131 = vcmpss_avx(auVar131,ZEXT416(0xc2b0c0a5),1);
          auVar159._8_4_ = 0x42b0c0a5;
          auVar159._0_8_ = 0x42b0c0a542b0c0a5;
          auVar159._12_4_ = 0x42b0c0a5;
          auVar131 = vblendvps_avx(auVar110,auVar159,auVar131);
          fVar94 = expf(auVar131._0_4_);
          fVar129 = 1.0 / (fVar94 + 1.0);
          break;
        case 5:
          local_2a8._0_4_ = fVar94;
          fVar94 = expf(fVar94);
          fVar94 = logf(fVar94 + 1.0);
          fVar94 = tanhf(fVar94);
          fVar129 = fVar94 * (float)local_2a8._0_4_;
          break;
        case 6:
          pfVar19 = (float *)(this->super_InnerProduct).activation_params.data;
          fVar304 = *pfVar19;
          fVar316 = pfVar19[1];
          fVar186 = -fVar316 / fVar304;
          fVar129 = 0.0;
          if ((fVar186 <= fVar94) && (fVar129 = fVar94, fVar94 <= fVar186 + 1.0 / fVar304)) {
            auVar131 = vfmadd213ss_fma(ZEXT416((uint)fVar304),auVar131,ZEXT416((uint)fVar316));
            fVar129 = auVar131._0_4_ * fVar94;
          }
        }
        *(float *)((long)top_blob->data + uVar30 * 4) = fVar129;
        uVar30 = uVar30 + 1;
      } while (uVar30 != local_238);
    }
    else if (iVar29 == 4) {
      iVar37 = 0;
      if ((int)uVar28 < 1) goto LAB_002ec1a0;
      uVar30 = 0;
      auVar285 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      do {
        auVar131 = ZEXT816(0) << 0x40;
        if (pvVar15 != (void *)0x0) {
          auVar131 = *(undefined1 (*) [16])((long)pvVar15 + uVar30 * 0x10);
        }
        pauVar33 = (undefined1 (*) [32])
                   ((long)(this->weight_data_tm).w * uVar30 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        puVar35 = (undefined4 *)local_3c8._0_8_;
        if ((int)uVar50 < 8) {
          auVar90 = SUB6432(ZEXT864(0),0);
          auVar269 = SUB6432(ZEXT864(0),0);
          auVar185 = ZEXT864(0);
          auVar128 = ZEXT864(0);
          uVar27 = 0;
        }
        else {
          auVar128 = ZEXT864(0);
          iVar37 = 7;
          auVar185 = ZEXT864(0);
          auVar210 = ZEXT864(0);
          auVar376 = ZEXT864(0);
          do {
            uVar1 = *puVar35;
            auVar236._4_4_ = uVar1;
            auVar236._0_4_ = uVar1;
            auVar236._8_4_ = uVar1;
            auVar236._12_4_ = uVar1;
            uVar1 = puVar35[1];
            auVar236._20_4_ = uVar1;
            auVar236._16_4_ = uVar1;
            auVar236._24_4_ = uVar1;
            auVar236._28_4_ = uVar1;
            uVar1 = puVar35[2];
            auVar329._4_4_ = uVar1;
            auVar329._0_4_ = uVar1;
            auVar329._8_4_ = uVar1;
            auVar329._12_4_ = uVar1;
            uVar1 = puVar35[3];
            auVar329._20_4_ = uVar1;
            auVar329._16_4_ = uVar1;
            auVar329._24_4_ = uVar1;
            auVar329._28_4_ = uVar1;
            uVar1 = puVar35[4];
            auVar349._4_4_ = uVar1;
            auVar349._0_4_ = uVar1;
            auVar349._8_4_ = uVar1;
            auVar349._12_4_ = uVar1;
            uVar1 = puVar35[5];
            auVar349._20_4_ = uVar1;
            auVar349._16_4_ = uVar1;
            auVar349._24_4_ = uVar1;
            auVar349._28_4_ = uVar1;
            uVar1 = puVar35[6];
            auVar355._4_4_ = uVar1;
            auVar355._0_4_ = uVar1;
            auVar355._8_4_ = uVar1;
            auVar355._12_4_ = uVar1;
            uVar1 = puVar35[7];
            auVar355._20_4_ = uVar1;
            auVar355._16_4_ = uVar1;
            auVar355._24_4_ = uVar1;
            auVar355._28_4_ = uVar1;
            auVar269 = vlddqu_avx(*pauVar33);
            auVar90 = vlddqu_avx(pauVar33[1]);
            auVar77 = vcvtph2ps_f16c(auVar269._0_16_);
            auVar187 = vfmadd231ps_fma(auVar128._0_32_,auVar236,auVar77);
            auVar128 = ZEXT1664(auVar187);
            auVar269 = vcvtph2ps_f16c(auVar269._16_16_);
            auVar187 = vfmadd231ps_fma(auVar185._0_32_,auVar329,auVar269);
            auVar185 = ZEXT1664(auVar187);
            auVar269 = vcvtph2ps_f16c(auVar90._0_16_);
            auVar187 = vfmadd231ps_fma(auVar210._0_32_,auVar349,auVar269);
            auVar210 = ZEXT1664(auVar187);
            auVar269 = ZEXT1632(auVar187);
            auVar90 = vcvtph2ps_f16c(auVar90._16_16_);
            auVar187 = vfmadd231ps_fma(auVar376._0_32_,auVar355,auVar90);
            auVar376 = ZEXT1664(auVar187);
            auVar90 = ZEXT1632(auVar187);
            puVar35 = puVar35 + 8;
            pauVar33 = pauVar33 + 2;
            iVar37 = iVar37 + 8;
            uVar27 = uVar50 & 0xfffffff8;
          } while (iVar37 < (int)uVar50);
        }
        auVar88 = auVar128._0_32_;
        auVar77 = auVar185._0_32_;
        uVar40 = uVar27 | 3;
        while ((int)uVar40 < (int)uVar50) {
          uVar1 = *puVar35;
          auVar237._4_4_ = uVar1;
          auVar237._0_4_ = uVar1;
          auVar237._8_4_ = uVar1;
          auVar237._12_4_ = uVar1;
          uVar1 = puVar35[1];
          auVar237._20_4_ = uVar1;
          auVar237._16_4_ = uVar1;
          auVar237._24_4_ = uVar1;
          auVar237._28_4_ = uVar1;
          uVar1 = puVar35[2];
          auVar330._4_4_ = uVar1;
          auVar330._0_4_ = uVar1;
          auVar330._8_4_ = uVar1;
          auVar330._12_4_ = uVar1;
          uVar1 = puVar35[3];
          auVar330._20_4_ = uVar1;
          auVar330._16_4_ = uVar1;
          auVar330._24_4_ = uVar1;
          auVar330._28_4_ = uVar1;
          auVar77 = vlddqu_avx(*pauVar33);
          auVar88 = vcvtph2ps_f16c(auVar77._0_16_);
          auVar187 = vfmadd231ps_fma(auVar128._0_32_,auVar237,auVar88);
          auVar128 = ZEXT1664(auVar187);
          auVar88 = ZEXT1632(auVar187);
          auVar77 = vcvtph2ps_f16c(auVar77._16_16_);
          auVar187 = vfmadd231ps_fma(auVar185._0_32_,auVar330,auVar77);
          auVar185 = ZEXT1664(auVar187);
          auVar77 = ZEXT1632(auVar187);
          puVar35 = puVar35 + 4;
          pauVar33 = pauVar33 + 1;
          uVar40 = uVar27 + 7;
          uVar27 = uVar27 + 4;
        }
        if (uVar50 - uVar27 != 0 && (int)uVar27 <= (int)uVar50) {
          lVar38 = 0;
          do {
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *(ulong *)(*pauVar33 + lVar38 * 8);
            auVar187 = vcvtph2ps_f16c(auVar8);
            uVar1 = puVar35[lVar38];
            auVar323._4_4_ = uVar1;
            auVar323._0_4_ = uVar1;
            auVar323._8_4_ = uVar1;
            auVar323._12_4_ = uVar1;
            auVar131 = vfmadd231ps_fma(auVar131,auVar323,auVar187);
            lVar38 = lVar38 + 1;
          } while (uVar50 - uVar27 != (int)lVar38);
        }
        fVar94 = auVar90._4_4_ + auVar269._4_4_ + auVar77._4_4_ + auVar88._4_4_;
        auVar95._0_4_ =
             auVar131._0_4_ +
             auVar90._16_4_ + auVar269._16_4_ + auVar77._16_4_ + auVar88._16_4_ +
             auVar90._0_4_ + auVar269._0_4_ + auVar77._0_4_ + auVar88._0_4_;
        auVar95._4_4_ = auVar131._4_4_ + fVar94 + fVar94;
        auVar95._8_4_ =
             auVar131._8_4_ +
             auVar90._24_4_ + auVar269._24_4_ + auVar77._24_4_ + auVar88._24_4_ +
             auVar90._8_4_ + auVar269._8_4_ + auVar77._8_4_ + auVar88._8_4_;
        auVar95._12_4_ =
             auVar131._12_4_ +
             auVar90._28_4_ + auVar269._28_4_ + auVar77._28_4_ + auVar88._28_4_ +
             auVar90._12_4_ + auVar269._12_4_ + auVar77._12_4_ + auVar88._12_4_;
        auVar131 = auVar285._0_16_;
        fVar94 = auVar285._0_4_;
        fVar129 = auVar285._4_4_;
        fVar304 = auVar285._8_4_;
        fVar316 = auVar285._12_4_;
        switch(iVar13) {
        case 1:
          auVar95 = vmaxps_avx(auVar95,_DAT_005a4060);
          break;
        case 2:
          auVar131 = vmaxps_avx(auVar95,ZEXT816(0) << 0x40);
          auVar187 = vminps_avx(auVar95,ZEXT816(0) << 0x40);
          uVar1 = *(this->super_InnerProduct).activation_params.data;
          auVar98._4_4_ = uVar1;
          auVar98._0_4_ = uVar1;
          auVar98._8_4_ = uVar1;
          auVar98._12_4_ = uVar1;
          auVar95 = vfmadd213ps_fma(auVar98,auVar187,auVar131);
          break;
        case 3:
          puVar35 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar1 = *puVar35;
          auVar135._4_4_ = uVar1;
          auVar135._0_4_ = uVar1;
          auVar135._8_4_ = uVar1;
          auVar135._12_4_ = uVar1;
          uVar1 = puVar35[1];
          auVar193._4_4_ = uVar1;
          auVar193._0_4_ = uVar1;
          auVar193._8_4_ = uVar1;
          auVar193._12_4_ = uVar1;
          auVar131 = vmaxps_avx(auVar95,auVar135);
          auVar95 = vminps_avx(auVar131,auVar193);
          break;
        case 4:
          uVar26 = CONCAT44(auVar95._4_4_,auVar95._0_4_);
          auVar96._0_8_ = uVar26 ^ 0x8000000080000000;
          auVar96._8_4_ = -auVar95._8_4_;
          auVar96._12_4_ = -auVar95._12_4_;
          auVar136._8_4_ = 0x42b0c0a5;
          auVar136._0_8_ = 0x42b0c0a542b0c0a5;
          auVar136._12_4_ = 0x42b0c0a5;
          auVar187 = vminps_avx(auVar96,auVar136);
          auVar137._8_4_ = 0xc2b0c0a5;
          auVar137._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar137._12_4_ = 0xc2b0c0a5;
          auVar99 = vmaxps_avx(auVar187,auVar137);
          auVar138._8_4_ = 0x3fb8aa3b;
          auVar138._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar138._12_4_ = 0x3fb8aa3b;
          auVar242._8_4_ = 0x3f000000;
          auVar242._0_8_ = 0x3f0000003f000000;
          auVar242._12_4_ = 0x3f000000;
          auVar187 = vfmadd213ps_fma(auVar138,auVar99,auVar242);
          auVar194._0_4_ = (int)auVar187._0_4_;
          auVar194._4_4_ = (int)auVar187._4_4_;
          auVar194._8_4_ = (int)auVar187._8_4_;
          auVar194._12_4_ = (int)auVar187._12_4_;
          auVar214 = vcvtdq2ps_avx(auVar194);
          auVar187 = vcmpps_avx(auVar187,auVar214,1);
          auVar187 = vandps_avx(auVar187,auVar131);
          auVar187 = vsubps_avx(auVar214,auVar187);
          auVar63._8_4_ = 0x3f318000;
          auVar63._0_8_ = 0x3f3180003f318000;
          auVar63._12_4_ = 0x3f318000;
          auVar214 = vfmsub231ps_fma(auVar99,auVar187,auVar63);
          auVar195._8_4_ = 0x395e8083;
          auVar195._0_8_ = 0x395e8083395e8083;
          auVar195._12_4_ = 0x395e8083;
          auVar99 = vfmsub231ps_fma(auVar214,auVar187,auVar195);
          auVar196._0_4_ = auVar99._0_4_ * auVar99._0_4_;
          auVar196._4_4_ = auVar99._4_4_ * auVar99._4_4_;
          auVar196._8_4_ = auVar99._8_4_ * auVar99._8_4_;
          auVar196._12_4_ = auVar99._12_4_ * auVar99._12_4_;
          auVar218._8_4_ = 0x39506967;
          auVar218._0_8_ = 0x3950696739506967;
          auVar218._12_4_ = 0x39506967;
          auVar309._8_4_ = 0x3ab743ce;
          auVar309._0_8_ = 0x3ab743ce3ab743ce;
          auVar309._12_4_ = 0x3ab743ce;
          auVar214 = vfmadd213ps_fma(auVar218,auVar99,auVar309);
          auVar287._8_4_ = 0x3c088908;
          auVar287._0_8_ = 0x3c0889083c088908;
          auVar287._12_4_ = 0x3c088908;
          auVar214 = vfmadd213ps_fma(auVar214,auVar99,auVar287);
          auVar64._8_4_ = 0x3d2aa9c1;
          auVar64._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar64._12_4_ = 0x3d2aa9c1;
          auVar214 = vfmadd213ps_fma(auVar214,auVar99,auVar64);
          auVar65._8_4_ = 0x3e2aaaaa;
          auVar65._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar65._12_4_ = 0x3e2aaaaa;
          auVar214 = vfmadd213ps_fma(auVar214,auVar99,auVar65);
          auVar214 = vfmadd213ps_fma(auVar214,auVar99,auVar242);
          auVar214 = vfmadd213ps_fma(auVar214,auVar196,auVar99);
          auVar97._0_4_ = auVar214._0_4_ + fVar94;
          auVar97._4_4_ = auVar214._4_4_ + fVar129;
          auVar97._8_4_ = auVar214._8_4_ + fVar304;
          auVar97._12_4_ = auVar214._12_4_ + fVar316;
          auVar139._0_4_ = (int)auVar187._0_4_;
          auVar139._4_4_ = (int)auVar187._4_4_;
          auVar139._8_4_ = (int)auVar187._8_4_;
          auVar139._12_4_ = (int)auVar187._12_4_;
          auVar187 = vpslld_avx(auVar139,0x17);
          auVar187 = vpaddd_avx(auVar187,auVar131);
          auVar187 = vfmadd213ps_fma(auVar187,auVar97,auVar131);
          auVar95 = vdivps_avx(auVar131,auVar187);
          break;
        case 5:
          auVar345._8_4_ = 0x42b0c0a5;
          auVar345._0_8_ = 0x42b0c0a542b0c0a5;
          auVar345._12_4_ = 0x42b0c0a5;
          auVar187 = vminps_avx(auVar345,auVar95);
          auVar352._8_4_ = 0xc2b0c0a5;
          auVar352._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar352._12_4_ = 0xc2b0c0a5;
          auVar99 = vmaxps_avx(auVar352,auVar187);
          auVar358._8_4_ = 0x3fb8aa3b;
          auVar358._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar358._12_4_ = 0x3fb8aa3b;
          auVar241._8_4_ = 0x3f000000;
          auVar241._0_8_ = 0x3f0000003f000000;
          auVar241._12_4_ = 0x3f000000;
          auVar187 = vfmadd213ps_fma(auVar358,auVar99,auVar241);
          auVar211._0_4_ = (int)auVar187._0_4_;
          auVar211._4_4_ = (int)auVar187._4_4_;
          auVar211._8_4_ = (int)auVar187._8_4_;
          auVar211._12_4_ = (int)auVar187._12_4_;
          auVar214 = vcvtdq2ps_avx(auVar211);
          auVar187 = vcmpps_avx(auVar187,auVar214,1);
          auVar187 = vandps_avx(auVar187,auVar131);
          auVar187 = vsubps_avx(auVar214,auVar187);
          auVar346._8_4_ = 0x3f318000;
          auVar346._0_8_ = 0x3f3180003f318000;
          auVar346._12_4_ = 0x3f318000;
          auVar214 = vfmsub231ps_fma(auVar99,auVar187,auVar346);
          auVar264._8_4_ = 0xb95e8083;
          auVar264._0_8_ = 0xb95e8083b95e8083;
          auVar264._12_4_ = 0xb95e8083;
          auVar99 = vfnmsub231ps_fma(auVar214,auVar187,auVar264);
          auVar212._0_4_ = auVar99._0_4_ * auVar99._0_4_;
          auVar212._4_4_ = auVar99._4_4_ * auVar99._4_4_;
          auVar212._8_4_ = auVar99._8_4_ * auVar99._8_4_;
          auVar212._12_4_ = auVar99._12_4_ * auVar99._12_4_;
          auVar370._8_4_ = 0x39506967;
          auVar370._0_8_ = 0x3950696739506967;
          auVar370._12_4_ = 0x39506967;
          auVar363._8_4_ = 0x3ab743ce;
          auVar363._0_8_ = 0x3ab743ce3ab743ce;
          auVar363._12_4_ = 0x3ab743ce;
          auVar214 = vfmadd213ps_fma(auVar370,auVar99,auVar363);
          auVar286._8_4_ = 0x3c088908;
          auVar286._0_8_ = 0x3c0889083c088908;
          auVar286._12_4_ = 0x3c088908;
          auVar214 = vfmadd213ps_fma(auVar214,auVar99,auVar286);
          auVar324._8_4_ = 0x3d2aa9c1;
          auVar324._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar324._12_4_ = 0x3d2aa9c1;
          auVar214 = vfmadd213ps_fma(auVar214,auVar99,auVar324);
          auVar325._8_4_ = 0x3e2aaaaa;
          auVar325._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar325._12_4_ = 0x3e2aaaaa;
          auVar214 = vfmadd213ps_fma(auVar214,auVar99,auVar325);
          auVar214 = vfmadd213ps_fma(auVar214,auVar99,auVar241);
          auVar214 = vfmadd213ps_fma(auVar214,auVar212,auVar99);
          auVar213._0_4_ = auVar214._0_4_ + fVar94;
          auVar213._4_4_ = auVar214._4_4_ + fVar129;
          auVar213._8_4_ = auVar214._8_4_ + fVar304;
          auVar213._12_4_ = auVar214._12_4_ + fVar316;
          auVar133._0_4_ = (int)auVar187._0_4_;
          auVar133._4_4_ = (int)auVar187._4_4_;
          auVar133._8_4_ = (int)auVar187._8_4_;
          auVar133._12_4_ = (int)auVar187._12_4_;
          auVar187 = vpslld_avx(auVar133,0x17);
          auVar187 = vpaddd_avx(auVar187,auVar131);
          auVar288 = vfmadd213ps_fma(auVar187,auVar213,auVar131);
          auVar188._8_4_ = 0x800000;
          auVar188._0_8_ = 0x80000000800000;
          auVar188._12_4_ = 0x800000;
          auVar187 = vmaxps_avx(auVar288,auVar188);
          auVar214 = vpsrld_avx(auVar187,0x17);
          auVar305._8_4_ = 0xffffff82;
          auVar305._0_8_ = 0xffffff82ffffff82;
          auVar305._12_4_ = 0xffffff82;
          auVar214 = vpaddd_avx(auVar305,auVar214);
          auVar306._8_4_ = 0x807fffff;
          auVar306._0_8_ = 0x807fffff807fffff;
          auVar306._12_4_ = 0x807fffff;
          auVar187 = vandps_avx(auVar306,auVar187);
          auVar265 = vorps_avx(auVar187,auVar241);
          auVar99 = vcvtdq2ps_avx(auVar214);
          auVar307._8_4_ = 0x3f3504f3;
          auVar307._0_8_ = 0x3f3504f33f3504f3;
          auVar307._12_4_ = 0x3f3504f3;
          auVar214 = vcmpps_avx(auVar265,auVar307,1);
          auVar187 = vandps_avx(auVar214,auVar265);
          auVar189._0_4_ = auVar187._0_4_ + auVar265._0_4_ + -1.0;
          auVar189._4_4_ = auVar187._4_4_ + auVar265._4_4_ + -1.0;
          auVar189._8_4_ = auVar187._8_4_ + auVar265._8_4_ + -1.0;
          auVar189._12_4_ = auVar187._12_4_ + auVar265._12_4_ + -1.0;
          auVar187 = vandps_avx(auVar214,auVar131);
          auVar214 = vsubps_avx(auVar99,auVar187);
          auVar308._0_4_ = auVar189._0_4_ * auVar189._0_4_;
          auVar308._4_4_ = auVar189._4_4_ * auVar189._4_4_;
          auVar308._8_4_ = auVar189._8_4_ * auVar189._8_4_;
          auVar308._12_4_ = auVar189._12_4_ * auVar189._12_4_;
          auVar326._8_4_ = 0x3d9021bb;
          auVar326._0_8_ = 0x3d9021bb3d9021bb;
          auVar326._12_4_ = 0x3d9021bb;
          auVar333._8_4_ = 0xbdebd1b8;
          auVar333._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar333._12_4_ = 0xbdebd1b8;
          auVar187 = vfmadd213ps_fma(auVar326,auVar189,auVar333);
          auVar334._8_4_ = 0x3def251a;
          auVar334._0_8_ = 0x3def251a3def251a;
          auVar334._12_4_ = 0x3def251a;
          auVar187 = vfmadd213ps_fma(auVar187,auVar189,auVar334);
          auVar335._8_4_ = 0xbdfe5d4f;
          auVar335._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar335._12_4_ = 0xbdfe5d4f;
          auVar187 = vfmadd213ps_fma(auVar187,auVar189,auVar335);
          auVar336._8_4_ = 0x3e11e9bf;
          auVar336._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar336._12_4_ = 0x3e11e9bf;
          auVar187 = vfmadd213ps_fma(auVar187,auVar189,auVar336);
          auVar337._8_4_ = 0xbe2aae50;
          auVar337._0_8_ = 0xbe2aae50be2aae50;
          auVar337._12_4_ = 0xbe2aae50;
          auVar187 = vfmadd213ps_fma(auVar187,auVar189,auVar337);
          auVar338._8_4_ = 0x3e4cceac;
          auVar338._0_8_ = 0x3e4cceac3e4cceac;
          auVar338._12_4_ = 0x3e4cceac;
          auVar187 = vfmadd213ps_fma(auVar187,auVar189,auVar338);
          auVar339._8_4_ = 0xbe7ffffc;
          auVar339._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar339._12_4_ = 0xbe7ffffc;
          auVar187 = vfmadd213ps_fma(auVar187,auVar189,auVar339);
          auVar340._8_4_ = 0x3eaaaaaa;
          auVar340._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar340._12_4_ = 0x3eaaaaaa;
          auVar187 = vfmadd213ps_fma(auVar187,auVar189,auVar340);
          auVar327._0_4_ = auVar308._0_4_ * auVar189._0_4_ * auVar187._0_4_;
          auVar327._4_4_ = auVar308._4_4_ * auVar189._4_4_ * auVar187._4_4_;
          auVar327._8_4_ = auVar308._8_4_ * auVar189._8_4_ * auVar187._8_4_;
          auVar327._12_4_ = auVar308._12_4_ * auVar189._12_4_ * auVar187._12_4_;
          auVar187 = vfmadd231ps_fma(auVar327,auVar214,auVar264);
          auVar99 = vfmsub231ps_fma(auVar187,auVar241,auVar308);
          auVar187 = vcmpps_avx(auVar288,_DAT_005a4060,2);
          auVar99 = vsubps_avx(auVar99,auVar189);
          auVar214 = vfnmadd231ps_fma(auVar99,auVar346,auVar214);
          auVar190._0_4_ = auVar214._0_4_ + auVar214._0_4_;
          auVar190._4_4_ = auVar214._4_4_ + auVar214._4_4_;
          auVar190._8_4_ = auVar214._8_4_ + auVar214._8_4_;
          auVar190._12_4_ = auVar214._12_4_ + auVar214._12_4_;
          auVar215._8_4_ = 0x7fffffff;
          auVar215._0_8_ = 0x7fffffff7fffffff;
          auVar215._12_4_ = 0x7fffffff;
          auVar187 = vblendvps_avx(auVar190,auVar215,auVar187);
          auVar191._8_4_ = 0x42b0c0a5;
          auVar191._0_8_ = 0x42b0c0a542b0c0a5;
          auVar191._12_4_ = 0x42b0c0a5;
          auVar187 = vminps_avx(auVar187,auVar191);
          auVar99 = vmaxps_avx(auVar352,auVar187);
          auVar187 = vfmadd213ps_fma(auVar358,auVar99,auVar241);
          auVar216._0_4_ = (int)auVar187._0_4_;
          auVar216._4_4_ = (int)auVar187._4_4_;
          auVar216._8_4_ = (int)auVar187._8_4_;
          auVar216._12_4_ = (int)auVar187._12_4_;
          auVar214 = vcvtdq2ps_avx(auVar216);
          auVar187 = vcmpps_avx(auVar187,auVar214,1);
          auVar187 = vandps_avx(auVar187,auVar131);
          auVar187 = vsubps_avx(auVar214,auVar187);
          auVar214 = vfmsub231ps_fma(auVar99,auVar187,auVar346);
          auVar99 = vfnmsub231ps_fma(auVar214,auVar187,auVar264);
          auVar285 = ZEXT1664(auVar131);
          auVar217._0_4_ = auVar99._0_4_ * auVar99._0_4_;
          auVar217._4_4_ = auVar99._4_4_ * auVar99._4_4_;
          auVar217._8_4_ = auVar99._8_4_ * auVar99._8_4_;
          auVar217._12_4_ = auVar99._12_4_ * auVar99._12_4_;
          auVar214 = vfmadd213ps_fma(auVar370,auVar99,auVar363);
          auVar214 = vfmadd213ps_fma(auVar214,auVar99,auVar286);
          auVar60._8_4_ = 0x3d2aa9c1;
          auVar60._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar60._12_4_ = 0x3d2aa9c1;
          auVar214 = vfmadd213ps_fma(auVar214,auVar99,auVar60);
          auVar61._8_4_ = 0x3e2aaaaa;
          auVar61._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar61._12_4_ = 0x3e2aaaaa;
          auVar214 = vfmadd213ps_fma(auVar214,auVar99,auVar61);
          auVar214 = vfmadd213ps_fma(auVar214,auVar99,auVar241);
          auVar214 = vfmadd213ps_fma(auVar214,auVar217,auVar99);
          auVar134._0_4_ = auVar214._0_4_ + fVar94;
          auVar134._4_4_ = auVar214._4_4_ + fVar129;
          auVar134._8_4_ = auVar214._8_4_ + fVar304;
          auVar134._12_4_ = auVar214._12_4_ + fVar316;
          auVar192._0_4_ = (int)auVar187._0_4_;
          auVar192._4_4_ = (int)auVar187._4_4_;
          auVar192._8_4_ = (int)auVar187._8_4_;
          auVar192._12_4_ = (int)auVar187._12_4_;
          auVar187 = vpslld_avx(auVar192,0x17);
          auVar187 = vpaddd_avx(auVar187,auVar131);
          auVar131 = vfmadd213ps_fma(auVar187,auVar134,auVar131);
          auVar62._8_4_ = 0x40000000;
          auVar62._0_8_ = 0x4000000040000000;
          auVar62._12_4_ = 0x40000000;
          auVar131 = vdivps_avx(auVar62,auVar131);
          auVar95 = vfmsub231ps_fma(auVar95,auVar95,auVar131);
          break;
        case 6:
          puVar35 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar1 = *puVar35;
          auVar140._4_4_ = uVar1;
          auVar140._0_4_ = uVar1;
          auVar140._8_4_ = uVar1;
          auVar140._12_4_ = uVar1;
          uVar1 = puVar35[1];
          auVar197._4_4_ = uVar1;
          auVar197._0_4_ = uVar1;
          auVar197._8_4_ = uVar1;
          auVar197._12_4_ = uVar1;
          auVar187 = vfmadd231ps_fma(auVar197,auVar95,auVar140);
          auVar187 = vmaxps_avx(auVar187,_DAT_005a4060);
          auVar131 = vminps_avx(auVar187,auVar131);
          auVar95._0_4_ = auVar131._0_4_ * auVar95._0_4_;
          auVar95._4_4_ = auVar131._4_4_ * auVar95._4_4_;
          auVar95._8_4_ = auVar131._8_4_ * auVar95._8_4_;
          auVar95._12_4_ = auVar131._12_4_ * auVar95._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar30 * 0x10) = auVar95;
        uVar30 = uVar30 + 1;
      } while (uVar30 != uVar28);
    }
    else {
      iVar37 = 0;
      if ((iVar29 != 8) || (iVar37 = 0, (int)uVar28 < 1)) goto LAB_002ec1a0;
      uVar30 = 0;
      auVar285 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      do {
        auVar128 = ZEXT1664(ZEXT816(0) << 0x40);
        if (pvVar15 != (void *)0x0) {
          auVar128 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar15 + uVar30 * 0x20));
        }
        pauVar33 = (undefined1 (*) [32])
                   ((long)(this->weight_data_tm).w * uVar30 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        puVar35 = (undefined4 *)local_3c8._0_8_;
        if ((int)uVar50 < 8) {
          auVar90 = SUB6432(ZEXT864(0),0);
          auVar88 = SUB6432(ZEXT864(0),0);
          auVar269 = SUB6432(ZEXT864(0),0);
          auVar77 = SUB6432(ZEXT864(0),0);
          auVar185 = ZEXT864(0);
          auVar210 = ZEXT864(0);
          auVar376 = ZEXT864(0);
          uVar27 = 0;
        }
        else {
          auVar376 = ZEXT864(0);
          iVar37 = 7;
          auVar210 = ZEXT864(0);
          auVar185 = ZEXT864(0);
          auVar351 = ZEXT864(0);
          auVar263 = ZEXT864(0);
          auVar357 = ZEXT864(0);
          auVar332 = ZEXT864(0);
          do {
            uVar1 = *puVar35;
            auVar359._4_4_ = uVar1;
            auVar359._0_4_ = uVar1;
            auVar359._8_4_ = uVar1;
            auVar359._12_4_ = uVar1;
            auVar359._16_4_ = uVar1;
            auVar359._20_4_ = uVar1;
            auVar359._24_4_ = uVar1;
            auVar359._28_4_ = uVar1;
            uVar1 = puVar35[1];
            auVar367._4_4_ = uVar1;
            auVar367._0_4_ = uVar1;
            auVar367._8_4_ = uVar1;
            auVar367._12_4_ = uVar1;
            auVar367._16_4_ = uVar1;
            auVar367._20_4_ = uVar1;
            auVar367._24_4_ = uVar1;
            auVar367._28_4_ = uVar1;
            uVar1 = puVar35[2];
            auVar342._4_4_ = uVar1;
            auVar342._0_4_ = uVar1;
            auVar342._8_4_ = uVar1;
            auVar342._12_4_ = uVar1;
            auVar342._16_4_ = uVar1;
            auVar342._20_4_ = uVar1;
            auVar342._24_4_ = uVar1;
            auVar342._28_4_ = uVar1;
            uVar1 = puVar35[3];
            auVar290._4_4_ = uVar1;
            auVar290._0_4_ = uVar1;
            auVar290._8_4_ = uVar1;
            auVar290._12_4_ = uVar1;
            auVar290._16_4_ = uVar1;
            auVar290._20_4_ = uVar1;
            auVar290._24_4_ = uVar1;
            auVar290._28_4_ = uVar1;
            auVar269 = vlddqu_avx(*pauVar33);
            auVar90 = vlddqu_avx(pauVar33[1]);
            auVar77 = vcvtph2ps_f16c(auVar269._0_16_);
            auVar131 = vfmadd231ps_fma(auVar128._0_32_,auVar359,auVar77);
            auVar128 = ZEXT1664(auVar131);
            auVar269 = vcvtph2ps_f16c(auVar269._16_16_);
            auVar131 = vfmadd231ps_fma(auVar376._0_32_,auVar367,auVar269);
            auVar376 = ZEXT1664(auVar131);
            auVar269 = vcvtph2ps_f16c(auVar90._0_16_);
            auVar131 = vfmadd231ps_fma(auVar210._0_32_,auVar342,auVar269);
            auVar210 = ZEXT1664(auVar131);
            auVar269 = vcvtph2ps_f16c(auVar90._16_16_);
            auVar131 = vfmadd231ps_fma(auVar185._0_32_,auVar290,auVar269);
            auVar185 = ZEXT1664(auVar131);
            uVar1 = puVar35[4];
            auVar74._4_4_ = uVar1;
            auVar74._0_4_ = uVar1;
            auVar74._8_4_ = uVar1;
            auVar74._12_4_ = uVar1;
            auVar74._16_4_ = uVar1;
            auVar74._20_4_ = uVar1;
            auVar74._24_4_ = uVar1;
            auVar74._28_4_ = uVar1;
            uVar1 = puVar35[5];
            auVar232._4_4_ = uVar1;
            auVar232._0_4_ = uVar1;
            auVar232._8_4_ = uVar1;
            auVar232._12_4_ = uVar1;
            auVar232._16_4_ = uVar1;
            auVar232._20_4_ = uVar1;
            auVar232._24_4_ = uVar1;
            auVar232._28_4_ = uVar1;
            uVar1 = puVar35[6];
            auVar291._4_4_ = uVar1;
            auVar291._0_4_ = uVar1;
            auVar291._8_4_ = uVar1;
            auVar291._12_4_ = uVar1;
            auVar291._16_4_ = uVar1;
            auVar291._20_4_ = uVar1;
            auVar291._24_4_ = uVar1;
            auVar291._28_4_ = uVar1;
            uVar1 = puVar35[7];
            auVar311._4_4_ = uVar1;
            auVar311._0_4_ = uVar1;
            auVar311._8_4_ = uVar1;
            auVar311._12_4_ = uVar1;
            auVar311._16_4_ = uVar1;
            auVar311._20_4_ = uVar1;
            auVar311._24_4_ = uVar1;
            auVar311._28_4_ = uVar1;
            auVar269 = vlddqu_avx(pauVar33[2]);
            auVar90 = vlddqu_avx(pauVar33[3]);
            auVar77 = vcvtph2ps_f16c(auVar269._0_16_);
            auVar131 = vfmadd231ps_fma(auVar351._0_32_,auVar74,auVar77);
            auVar351 = ZEXT1664(auVar131);
            auVar77 = ZEXT1632(auVar131);
            auVar269 = vcvtph2ps_f16c(auVar269._16_16_);
            auVar131 = vfmadd231ps_fma(auVar263._0_32_,auVar232,auVar269);
            auVar263 = ZEXT1664(auVar131);
            auVar269 = ZEXT1632(auVar131);
            auVar88 = vcvtph2ps_f16c(auVar90._0_16_);
            auVar131 = vfmadd231ps_fma(auVar357._0_32_,auVar291,auVar88);
            auVar357 = ZEXT1664(auVar131);
            auVar88 = ZEXT1632(auVar131);
            auVar90 = vcvtph2ps_f16c(auVar90._16_16_);
            auVar131 = vfmadd231ps_fma(auVar332._0_32_,auVar311,auVar90);
            auVar332 = ZEXT1664(auVar131);
            auVar90 = ZEXT1632(auVar131);
            puVar35 = puVar35 + 8;
            pauVar33 = pauVar33 + 4;
            iVar37 = iVar37 + 8;
            uVar27 = uVar50 & 0xfffffff8;
          } while (iVar37 < (int)uVar50);
        }
        auVar184 = auVar376._0_32_;
        auVar183 = auVar210._0_32_;
        auVar127 = auVar185._0_32_;
        uVar40 = uVar27 | 3;
        while (auVar111 = auVar128._0_32_, (int)uVar40 < (int)uVar50) {
          uVar1 = *puVar35;
          auVar75._4_4_ = uVar1;
          auVar75._0_4_ = uVar1;
          auVar75._8_4_ = uVar1;
          auVar75._12_4_ = uVar1;
          auVar75._16_4_ = uVar1;
          auVar75._20_4_ = uVar1;
          auVar75._24_4_ = uVar1;
          auVar75._28_4_ = uVar1;
          uVar1 = puVar35[1];
          auVar233._4_4_ = uVar1;
          auVar233._0_4_ = uVar1;
          auVar233._8_4_ = uVar1;
          auVar233._12_4_ = uVar1;
          auVar233._16_4_ = uVar1;
          auVar233._20_4_ = uVar1;
          auVar233._24_4_ = uVar1;
          auVar233._28_4_ = uVar1;
          uVar1 = puVar35[2];
          auVar292._4_4_ = uVar1;
          auVar292._0_4_ = uVar1;
          auVar292._8_4_ = uVar1;
          auVar292._12_4_ = uVar1;
          auVar292._16_4_ = uVar1;
          auVar292._20_4_ = uVar1;
          auVar292._24_4_ = uVar1;
          auVar292._28_4_ = uVar1;
          uVar1 = puVar35[3];
          auVar312._4_4_ = uVar1;
          auVar312._0_4_ = uVar1;
          auVar312._8_4_ = uVar1;
          auVar312._12_4_ = uVar1;
          auVar312._16_4_ = uVar1;
          auVar312._20_4_ = uVar1;
          auVar312._24_4_ = uVar1;
          auVar312._28_4_ = uVar1;
          auVar127 = vlddqu_avx(*pauVar33);
          auVar20 = vlddqu_avx(pauVar33[1]);
          auVar183 = vcvtph2ps_f16c(auVar127._0_16_);
          auVar131 = vfmadd231ps_fma(auVar111,auVar75,auVar183);
          auVar128 = ZEXT1664(auVar131);
          auVar127 = vcvtph2ps_f16c(auVar127._16_16_);
          auVar131 = vfmadd231ps_fma(auVar376._0_32_,auVar233,auVar127);
          auVar376 = ZEXT1664(auVar131);
          auVar184 = ZEXT1632(auVar131);
          auVar127 = vcvtph2ps_f16c(auVar20._0_16_);
          auVar131 = vfmadd231ps_fma(auVar210._0_32_,auVar292,auVar127);
          auVar210 = ZEXT1664(auVar131);
          auVar183 = ZEXT1632(auVar131);
          auVar127 = vcvtph2ps_f16c(auVar20._16_16_);
          auVar131 = vfmadd231ps_fma(auVar185._0_32_,auVar312,auVar127);
          auVar185 = ZEXT1664(auVar131);
          auVar127 = ZEXT1632(auVar131);
          puVar35 = puVar35 + 4;
          pauVar33 = pauVar33 + 2;
          uVar40 = uVar27 + 7;
          uVar27 = uVar27 + 4;
        }
        if (uVar50 - uVar27 != 0 && (int)uVar27 <= (int)uVar50) {
          lVar38 = 0;
          do {
            uVar1 = puVar35[lVar38];
            auVar76._4_4_ = uVar1;
            auVar76._0_4_ = uVar1;
            auVar76._8_4_ = uVar1;
            auVar76._12_4_ = uVar1;
            auVar76._16_4_ = uVar1;
            auVar76._20_4_ = uVar1;
            auVar76._24_4_ = uVar1;
            auVar76._28_4_ = uVar1;
            auVar131 = vlddqu_avx(*(undefined1 (*) [16])*pauVar33);
            auVar111 = vcvtph2ps_f16c(auVar131);
            auVar131 = vfmadd231ps_fma(auVar128._0_32_,auVar76,auVar111);
            auVar128 = ZEXT1664(auVar131);
            auVar111 = ZEXT1632(auVar131);
            pauVar33 = (undefined1 (*) [32])(*pauVar33 + 0x10);
            lVar38 = lVar38 + 1;
          } while (uVar50 - uVar27 != (int)lVar38);
        }
        fVar94 = auVar88._0_4_ + auVar90._0_4_ + auVar77._0_4_ + auVar269._0_4_ +
                 auVar184._0_4_ + auVar127._0_4_ + auVar183._0_4_ + auVar111._0_4_;
        fVar129 = auVar88._4_4_ + auVar90._4_4_ + auVar77._4_4_ + auVar269._4_4_ +
                  auVar184._4_4_ + auVar127._4_4_ + auVar183._4_4_ + auVar111._4_4_;
        auVar112._0_8_ = CONCAT44(fVar129,fVar94);
        auVar112._8_4_ =
             auVar88._8_4_ + auVar90._8_4_ + auVar77._8_4_ + auVar269._8_4_ +
             auVar184._8_4_ + auVar127._8_4_ + auVar183._8_4_ + auVar111._8_4_;
        auVar112._12_4_ =
             auVar88._12_4_ + auVar90._12_4_ + auVar77._12_4_ + auVar269._12_4_ +
             auVar184._12_4_ + auVar127._12_4_ + auVar183._12_4_ + auVar111._12_4_;
        auVar112._16_4_ =
             auVar88._16_4_ + auVar90._16_4_ + auVar77._16_4_ + auVar269._16_4_ +
             auVar184._16_4_ + auVar127._16_4_ + auVar183._16_4_ + auVar111._16_4_;
        auVar112._20_4_ =
             auVar88._20_4_ + auVar90._20_4_ + auVar77._20_4_ + auVar269._20_4_ +
             auVar184._20_4_ + auVar127._20_4_ + auVar183._20_4_ + auVar111._20_4_;
        auVar112._24_4_ =
             auVar88._24_4_ + auVar90._24_4_ + auVar77._24_4_ + auVar269._24_4_ +
             auVar184._24_4_ + auVar127._24_4_ + auVar183._24_4_ + auVar111._24_4_;
        auVar112._28_4_ =
             auVar88._28_4_ + auVar90._28_4_ + auVar77._28_4_ + auVar269._28_4_ +
             auVar184._28_4_ + auVar127._28_4_ + auVar183._28_4_ + auVar111._28_4_;
        auVar269 = auVar285._0_32_;
        fVar304 = auVar285._0_4_;
        fVar316 = auVar285._4_4_;
        fVar186 = auVar285._8_4_;
        fVar317 = auVar285._12_4_;
        fVar318 = auVar285._16_4_;
        fVar319 = auVar285._20_4_;
        fVar320 = auVar285._24_4_;
        fVar321 = auVar285._28_4_;
        switch(iVar13) {
        case 1:
          auVar112 = vmaxps_avx(auVar112,_DAT_005a85e0);
          break;
        case 2:
          auVar269 = vmaxps_avx(auVar112,ZEXT432(0) << 0x20);
          auVar90 = vminps_avx(auVar112,ZEXT432(0) << 0x20);
          uVar1 = *(this->super_InnerProduct).activation_params.data;
          auVar117._4_4_ = uVar1;
          auVar117._0_4_ = uVar1;
          auVar117._8_4_ = uVar1;
          auVar117._12_4_ = uVar1;
          auVar117._16_4_ = uVar1;
          auVar117._20_4_ = uVar1;
          auVar117._24_4_ = uVar1;
          auVar117._28_4_ = uVar1;
          auVar131 = vfmadd213ps_fma(auVar117,auVar90,auVar269);
          auVar112 = ZEXT1632(auVar131);
          break;
        case 3:
          puVar35 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar1 = *puVar35;
          auVar83._4_4_ = uVar1;
          auVar83._0_4_ = uVar1;
          auVar83._8_4_ = uVar1;
          auVar83._12_4_ = uVar1;
          auVar83._16_4_ = uVar1;
          auVar83._20_4_ = uVar1;
          auVar83._24_4_ = uVar1;
          auVar83._28_4_ = uVar1;
          uVar1 = puVar35[1];
          auVar168._4_4_ = uVar1;
          auVar168._0_4_ = uVar1;
          auVar168._8_4_ = uVar1;
          auVar168._12_4_ = uVar1;
          auVar168._16_4_ = uVar1;
          auVar168._20_4_ = uVar1;
          auVar168._24_4_ = uVar1;
          auVar168._28_4_ = uVar1;
          auVar269 = vmaxps_avx(auVar112,auVar83);
          auVar112 = vminps_avx(auVar269,auVar168);
          break;
        case 4:
          auVar84._0_8_ = auVar112._0_8_ ^ 0x8000000080000000;
          auVar84._8_4_ = -auVar112._8_4_;
          auVar84._12_4_ = -auVar112._12_4_;
          auVar84._16_4_ = -auVar112._16_4_;
          auVar84._20_4_ = -auVar112._20_4_;
          auVar84._24_4_ = -auVar112._24_4_;
          auVar84._28_4_ = -auVar112._28_4_;
          auVar113._8_4_ = 0x42b0c0a5;
          auVar113._0_8_ = 0x42b0c0a542b0c0a5;
          auVar113._12_4_ = 0x42b0c0a5;
          auVar113._16_4_ = 0x42b0c0a5;
          auVar113._20_4_ = 0x42b0c0a5;
          auVar113._24_4_ = 0x42b0c0a5;
          auVar113._28_4_ = 0x42b0c0a5;
          auVar90 = vminps_avx(auVar84,auVar113);
          auVar114._8_4_ = 0xc2b0c0a5;
          auVar114._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar114._12_4_ = 0xc2b0c0a5;
          auVar114._16_4_ = 0xc2b0c0a5;
          auVar114._20_4_ = 0xc2b0c0a5;
          auVar114._24_4_ = 0xc2b0c0a5;
          auVar114._28_4_ = 0xc2b0c0a5;
          auVar77 = vmaxps_avx(auVar90,auVar114);
          auVar115._8_4_ = 0x3fb8aa3b;
          auVar115._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar115._12_4_ = 0x3fb8aa3b;
          auVar115._16_4_ = 0x3fb8aa3b;
          auVar115._20_4_ = 0x3fb8aa3b;
          auVar115._24_4_ = 0x3fb8aa3b;
          auVar115._28_4_ = 0x3fb8aa3b;
          auVar235._8_4_ = 0x3f000000;
          auVar235._0_8_ = 0x3f0000003f000000;
          auVar235._12_4_ = 0x3f000000;
          auVar235._16_4_ = 0x3f000000;
          auVar235._20_4_ = 0x3f000000;
          auVar235._24_4_ = 0x3f000000;
          auVar235._28_4_ = 0x3f000000;
          auVar131 = vfmadd213ps_fma(auVar115,auVar77,auVar235);
          auVar88 = vroundps_avx(ZEXT1632(auVar131),1);
          auVar90 = vcmpps_avx(ZEXT1632(auVar131),auVar88,1);
          auVar90 = vandps_avx(auVar90,auVar269);
          auVar90 = vsubps_avx(auVar88,auVar90);
          auVar169._8_4_ = 0x3f318000;
          auVar169._0_8_ = 0x3f3180003f318000;
          auVar169._12_4_ = 0x3f318000;
          auVar169._16_4_ = 0x3f318000;
          auVar169._20_4_ = 0x3f318000;
          auVar169._24_4_ = 0x3f318000;
          auVar169._28_4_ = 0x3f318000;
          auVar131 = vfmsub231ps_fma(auVar77,auVar90,auVar169);
          auVar170._8_4_ = 0x395e8083;
          auVar170._0_8_ = 0x395e8083395e8083;
          auVar170._12_4_ = 0x395e8083;
          auVar170._16_4_ = 0x395e8083;
          auVar170._20_4_ = 0x395e8083;
          auVar170._24_4_ = 0x395e8083;
          auVar170._28_4_ = 0x395e8083;
          auVar187 = vfmsub231ps_fma(ZEXT1632(auVar131),auVar90,auVar170);
          auVar77 = ZEXT1632(auVar187);
          auVar24._28_4_ = 0x395e8083;
          auVar24._0_28_ =
               ZEXT1628(CONCAT412(auVar187._12_4_ * auVar187._12_4_,
                                  CONCAT48(auVar187._8_4_ * auVar187._8_4_,
                                           CONCAT44(auVar187._4_4_ * auVar187._4_4_,
                                                    auVar187._0_4_ * auVar187._0_4_))));
          auVar205._8_4_ = 0x39506967;
          auVar205._0_8_ = 0x3950696739506967;
          auVar205._12_4_ = 0x39506967;
          auVar205._16_4_ = 0x39506967;
          auVar205._20_4_ = 0x39506967;
          auVar205._24_4_ = 0x39506967;
          auVar205._28_4_ = 0x39506967;
          auVar251._8_4_ = 0x3ab743ce;
          auVar251._0_8_ = 0x3ab743ce3ab743ce;
          auVar251._12_4_ = 0x3ab743ce;
          auVar251._16_4_ = 0x3ab743ce;
          auVar251._20_4_ = 0x3ab743ce;
          auVar251._24_4_ = 0x3ab743ce;
          auVar251._28_4_ = 0x3ab743ce;
          auVar131 = vfmadd213ps_fma(auVar205,auVar77,auVar251);
          auVar252._8_4_ = 0x3c088908;
          auVar252._0_8_ = 0x3c0889083c088908;
          auVar252._12_4_ = 0x3c088908;
          auVar252._16_4_ = 0x3c088908;
          auVar252._20_4_ = 0x3c088908;
          auVar252._24_4_ = 0x3c088908;
          auVar252._28_4_ = 0x3c088908;
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar252);
          auVar253._8_4_ = 0x3d2aa9c1;
          auVar253._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar253._12_4_ = 0x3d2aa9c1;
          auVar253._16_4_ = 0x3d2aa9c1;
          auVar253._20_4_ = 0x3d2aa9c1;
          auVar253._24_4_ = 0x3d2aa9c1;
          auVar253._28_4_ = 0x3d2aa9c1;
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar253);
          auVar254._8_4_ = 0x3e2aaaaa;
          auVar254._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar254._12_4_ = 0x3e2aaaaa;
          auVar254._16_4_ = 0x3e2aaaaa;
          auVar254._20_4_ = 0x3e2aaaaa;
          auVar254._24_4_ = 0x3e2aaaaa;
          auVar254._28_4_ = 0x3e2aaaaa;
          auVar77 = ZEXT1632(auVar187);
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar254);
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar235);
          auVar214 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar24,auVar77);
          auVar59._0_4_ = (int)auVar90._0_4_;
          auVar59._4_4_ = (int)auVar90._4_4_;
          auVar59._8_4_ = (int)auVar90._8_4_;
          auVar59._12_4_ = (int)auVar90._12_4_;
          auVar85._16_4_ = (int)auVar90._16_4_;
          auVar85._0_16_ = auVar59;
          auVar85._20_4_ = (int)auVar90._20_4_;
          auVar85._24_4_ = (int)auVar90._24_4_;
          auVar85._28_4_ = (int)auVar90._28_4_;
          auVar187 = vpslld_avx(auVar59,0x17);
          auVar131 = vpslld_avx(auVar85._16_16_,0x17);
          auVar132._8_4_ = 0x3f800000;
          auVar132._0_8_ = 0x3f8000003f800000;
          auVar132._12_4_ = 0x3f800000;
          auVar131 = vpaddd_avx(auVar131,auVar132);
          auVar187 = vpaddd_avx(auVar187,auVar132);
          auVar86._16_16_ = auVar131;
          auVar86._0_16_ = auVar187;
          auVar116._0_4_ = auVar214._0_4_ + fVar304;
          auVar116._4_4_ = auVar214._4_4_ + fVar316;
          auVar116._8_4_ = auVar214._8_4_ + fVar186;
          auVar116._12_4_ = auVar214._12_4_ + fVar317;
          auVar116._16_4_ = fVar318 + 0.0;
          auVar116._20_4_ = fVar319 + 0.0;
          auVar116._24_4_ = fVar320 + 0.0;
          auVar116._28_4_ = fVar321 + 0.0;
          auVar131 = vfmadd213ps_fma(auVar86,auVar116,auVar269);
          auVar112 = vdivps_avx(auVar269,ZEXT1632(auVar131));
          break;
        case 5:
          auVar313._8_4_ = 0x42b0c0a5;
          auVar313._0_8_ = 0x42b0c0a542b0c0a5;
          auVar313._12_4_ = 0x42b0c0a5;
          auVar313._16_4_ = 0x42b0c0a5;
          auVar313._20_4_ = 0x42b0c0a5;
          auVar313._24_4_ = 0x42b0c0a5;
          auVar313._28_4_ = 0x42b0c0a5;
          auVar90 = vminps_avx(auVar313,auVar112);
          auVar328._8_4_ = 0xc2b0c0a5;
          auVar328._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar328._12_4_ = 0xc2b0c0a5;
          auVar328._16_4_ = 0xc2b0c0a5;
          auVar328._20_4_ = 0xc2b0c0a5;
          auVar328._24_4_ = 0xc2b0c0a5;
          auVar328._28_4_ = 0xc2b0c0a5;
          auVar77 = vmaxps_avx(auVar328,auVar90);
          auVar161._8_4_ = 0x3fb8aa3b;
          auVar161._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar161._12_4_ = 0x3fb8aa3b;
          auVar161._16_4_ = 0x3fb8aa3b;
          auVar161._20_4_ = 0x3fb8aa3b;
          auVar161._24_4_ = 0x3fb8aa3b;
          auVar161._28_4_ = 0x3fb8aa3b;
          auVar343._8_4_ = 0x3f000000;
          auVar343._0_8_ = 0x3f0000003f000000;
          auVar343._12_4_ = 0x3f000000;
          auVar343._16_4_ = 0x3f000000;
          auVar343._20_4_ = 0x3f000000;
          auVar343._24_4_ = 0x3f000000;
          auVar343._28_4_ = 0x3f000000;
          auVar131 = vfmadd213ps_fma(auVar161,auVar77,auVar343);
          auVar88 = vroundps_avx(ZEXT1632(auVar131),1);
          auVar90 = vcmpps_avx(ZEXT1632(auVar131),auVar88,1);
          auVar90 = vandps_avx(auVar90,auVar269);
          auVar90 = vsubps_avx(auVar88,auVar90);
          auVar354._8_4_ = 0x3f318000;
          auVar354._0_8_ = 0x3f3180003f318000;
          auVar354._12_4_ = 0x3f318000;
          auVar354._16_4_ = 0x3f318000;
          auVar354._20_4_ = 0x3f318000;
          auVar354._24_4_ = 0x3f318000;
          auVar354._28_4_ = 0x3f318000;
          auVar131 = vfmsub231ps_fma(auVar77,auVar90,auVar354);
          auVar348._8_4_ = 0xb95e8083;
          auVar348._0_8_ = 0xb95e8083b95e8083;
          auVar348._12_4_ = 0xb95e8083;
          auVar348._16_4_ = 0xb95e8083;
          auVar348._20_4_ = 0xb95e8083;
          auVar348._24_4_ = 0xb95e8083;
          auVar348._28_4_ = 0xb95e8083;
          auVar187 = vfnmsub231ps_fma(ZEXT1632(auVar131),auVar90,auVar348);
          auVar77 = ZEXT1632(auVar187);
          auVar21._28_4_ = auVar88._28_4_;
          auVar21._0_28_ =
               ZEXT1628(CONCAT412(auVar187._12_4_ * auVar187._12_4_,
                                  CONCAT48(auVar187._8_4_ * auVar187._8_4_,
                                           CONCAT44(auVar187._4_4_ * auVar187._4_4_,
                                                    auVar187._0_4_ * auVar187._0_4_))));
          auVar368._8_4_ = 0x39506967;
          auVar368._0_8_ = 0x3950696739506967;
          auVar368._12_4_ = 0x39506967;
          auVar368._16_4_ = 0x39506967;
          auVar368._20_4_ = 0x39506967;
          auVar368._24_4_ = 0x39506967;
          auVar368._28_4_ = 0x39506967;
          auVar360._8_4_ = 0x3ab743ce;
          auVar360._0_8_ = 0x3ab743ce3ab743ce;
          auVar360._12_4_ = 0x3ab743ce;
          auVar360._16_4_ = 0x3ab743ce;
          auVar360._20_4_ = 0x3ab743ce;
          auVar360._24_4_ = 0x3ab743ce;
          auVar360._28_4_ = 0x3ab743ce;
          auVar131 = vfmadd213ps_fma(auVar368,auVar77,auVar360);
          auVar374._8_4_ = 0x3c088908;
          auVar374._0_8_ = 0x3c0889083c088908;
          auVar374._12_4_ = 0x3c088908;
          auVar374._16_4_ = 0x3c088908;
          auVar374._20_4_ = 0x3c088908;
          auVar374._24_4_ = 0x3c088908;
          auVar374._28_4_ = 0x3c088908;
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar374);
          auVar270._8_4_ = 0x3d2aa9c1;
          auVar270._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar270._12_4_ = 0x3d2aa9c1;
          auVar270._16_4_ = 0x3d2aa9c1;
          auVar270._20_4_ = 0x3d2aa9c1;
          auVar270._24_4_ = 0x3d2aa9c1;
          auVar270._28_4_ = 0x3d2aa9c1;
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar270);
          auVar247._8_4_ = 0x3e2aaaaa;
          auVar247._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar247._12_4_ = 0x3e2aaaaa;
          auVar247._16_4_ = 0x3e2aaaaa;
          auVar247._20_4_ = 0x3e2aaaaa;
          auVar247._24_4_ = 0x3e2aaaaa;
          auVar247._28_4_ = 0x3e2aaaaa;
          auVar77 = ZEXT1632(auVar187);
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar247);
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar343);
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar21,auVar77);
          auVar78._0_4_ = fVar304 + auVar131._0_4_;
          auVar78._4_4_ = fVar316 + auVar131._4_4_;
          auVar78._8_4_ = fVar186 + auVar131._8_4_;
          auVar78._12_4_ = fVar317 + auVar131._12_4_;
          auVar78._16_4_ = fVar318 + 0.0;
          auVar78._20_4_ = fVar319 + 0.0;
          auVar78._24_4_ = fVar320 + 0.0;
          auVar78._28_4_ = fVar321 + 0.0;
          auVar130._0_4_ = (int)auVar90._0_4_;
          auVar130._4_4_ = (int)auVar90._4_4_;
          auVar130._8_4_ = (int)auVar90._8_4_;
          auVar130._12_4_ = (int)auVar90._12_4_;
          auVar162._16_4_ = (int)auVar90._16_4_;
          auVar162._0_16_ = auVar130;
          auVar162._20_4_ = (int)auVar90._20_4_;
          auVar162._24_4_ = (int)auVar90._24_4_;
          auVar162._28_4_ = (int)auVar90._28_4_;
          auVar187 = vpslld_avx(auVar130,0x17);
          auVar131 = vpslld_avx(auVar162._16_16_,0x17);
          auVar322._8_4_ = 0x3f800000;
          auVar322._0_8_ = 0x3f8000003f800000;
          auVar322._12_4_ = 0x3f800000;
          auVar131 = vpaddd_avx(auVar322,auVar131);
          auVar187 = vpaddd_avx(auVar322,auVar187);
          auVar163._16_16_ = auVar131;
          auVar163._0_16_ = auVar187;
          auVar214 = vfmadd213ps_fma(auVar163,auVar78,auVar269);
          auVar79._8_4_ = 0x800000;
          auVar79._0_8_ = 0x80000000800000;
          auVar79._12_4_ = 0x800000;
          auVar79._16_4_ = 0x800000;
          auVar79._20_4_ = 0x800000;
          auVar79._24_4_ = 0x800000;
          auVar79._28_4_ = 0x800000;
          auVar90 = vmaxps_avx(ZEXT1632(auVar214),auVar79);
          auVar187 = vpsrld_avx(auVar90._0_16_,0x17);
          auVar131 = vpsrld_avx(auVar90._16_16_,0x17);
          auVar201._8_4_ = 0x807fffff;
          auVar201._0_8_ = 0x807fffff807fffff;
          auVar201._12_4_ = 0x807fffff;
          auVar201._16_4_ = 0x807fffff;
          auVar201._20_4_ = 0x807fffff;
          auVar201._24_4_ = 0x807fffff;
          auVar201._28_4_ = 0x807fffff;
          auVar90 = vandps_avx(auVar90,auVar201);
          auVar88 = vorps_avx(auVar343,auVar90);
          auVar202._8_4_ = 0x3f3504f3;
          auVar202._0_8_ = 0x3f3504f33f3504f3;
          auVar202._12_4_ = 0x3f3504f3;
          auVar202._16_4_ = 0x3f3504f3;
          auVar202._20_4_ = 0x3f3504f3;
          auVar202._24_4_ = 0x3f3504f3;
          auVar202._28_4_ = 0x3f3504f3;
          auVar77 = vcmpps_avx(auVar202,auVar88,2);
          auVar90 = vandnps_avx(auVar77,auVar88);
          auVar361._8_4_ = 0xbf800000;
          auVar361._0_8_ = 0xbf800000bf800000;
          auVar361._12_4_ = 0xbf800000;
          auVar361._16_4_ = 0xbf800000;
          auVar361._20_4_ = 0xbf800000;
          auVar361._24_4_ = 0xbf800000;
          auVar361._28_4_ = 0xbf800000;
          auVar203._0_4_ = auVar88._0_4_ + -1.0 + auVar90._0_4_;
          auVar203._4_4_ = auVar88._4_4_ + -1.0 + auVar90._4_4_;
          auVar203._8_4_ = auVar88._8_4_ + -1.0 + auVar90._8_4_;
          auVar203._12_4_ = auVar88._12_4_ + -1.0 + auVar90._12_4_;
          auVar203._16_4_ = auVar88._16_4_ + -1.0 + auVar90._16_4_;
          auVar203._20_4_ = auVar88._20_4_ + -1.0 + auVar90._20_4_;
          auVar203._24_4_ = auVar88._24_4_ + -1.0 + auVar90._24_4_;
          auVar203._28_4_ = auVar88._28_4_ + -1.0 + auVar90._28_4_;
          auVar131 = vpsubd_avx(auVar131,auVar77._16_16_);
          auVar240._8_4_ = 0xffffff81;
          auVar240._0_8_ = 0xffffff81ffffff81;
          auVar240._12_4_ = 0xffffff81;
          auVar131 = vpaddd_avx(auVar131,auVar240);
          auVar187 = vpsubd_avx(auVar187,auVar77._0_16_);
          auVar187 = vpaddd_avx(auVar187,auVar240);
          auVar80._16_16_ = auVar131;
          auVar80._0_16_ = auVar187;
          auVar234._0_4_ = auVar203._0_4_ * auVar203._0_4_;
          auVar234._4_4_ = auVar203._4_4_ * auVar203._4_4_;
          auVar234._8_4_ = auVar203._8_4_ * auVar203._8_4_;
          auVar234._12_4_ = auVar203._12_4_ * auVar203._12_4_;
          auVar234._16_4_ = auVar203._16_4_ * auVar203._16_4_;
          auVar234._20_4_ = auVar203._20_4_ * auVar203._20_4_;
          auVar234._24_4_ = auVar203._24_4_ * auVar203._24_4_;
          auVar234._28_4_ = 0;
          auVar248._8_4_ = 0x3d9021bb;
          auVar248._0_8_ = 0x3d9021bb3d9021bb;
          auVar248._12_4_ = 0x3d9021bb;
          auVar248._16_4_ = 0x3d9021bb;
          auVar248._20_4_ = 0x3d9021bb;
          auVar248._24_4_ = 0x3d9021bb;
          auVar248._28_4_ = 0x3d9021bb;
          auVar293._8_4_ = 0xbdebd1b8;
          auVar293._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar293._12_4_ = 0xbdebd1b8;
          auVar293._16_4_ = 0xbdebd1b8;
          auVar293._20_4_ = 0xbdebd1b8;
          auVar293._24_4_ = 0xbdebd1b8;
          auVar293._28_4_ = 0xbdebd1b8;
          auVar131 = vfmadd213ps_fma(auVar248,auVar203,auVar293);
          auVar294._8_4_ = 0x3def251a;
          auVar294._0_8_ = 0x3def251a3def251a;
          auVar294._12_4_ = 0x3def251a;
          auVar294._16_4_ = 0x3def251a;
          auVar294._20_4_ = 0x3def251a;
          auVar294._24_4_ = 0x3def251a;
          auVar294._28_4_ = 0x3def251a;
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar203,auVar294);
          auVar295._8_4_ = 0xbdfe5d4f;
          auVar295._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar295._12_4_ = 0xbdfe5d4f;
          auVar295._16_4_ = 0xbdfe5d4f;
          auVar295._20_4_ = 0xbdfe5d4f;
          auVar295._24_4_ = 0xbdfe5d4f;
          auVar295._28_4_ = 0xbdfe5d4f;
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar203,auVar295);
          auVar296._8_4_ = 0x3e11e9bf;
          auVar296._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar296._12_4_ = 0x3e11e9bf;
          auVar296._16_4_ = 0x3e11e9bf;
          auVar296._20_4_ = 0x3e11e9bf;
          auVar296._24_4_ = 0x3e11e9bf;
          auVar296._28_4_ = 0x3e11e9bf;
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar203,auVar296);
          auVar297._8_4_ = 0xbe2aae50;
          auVar297._0_8_ = 0xbe2aae50be2aae50;
          auVar297._12_4_ = 0xbe2aae50;
          auVar297._16_4_ = 0xbe2aae50;
          auVar297._20_4_ = 0xbe2aae50;
          auVar297._24_4_ = 0xbe2aae50;
          auVar297._28_4_ = 0xbe2aae50;
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar203,auVar297);
          auVar298._8_4_ = 0x3e4cceac;
          auVar298._0_8_ = 0x3e4cceac3e4cceac;
          auVar298._12_4_ = 0x3e4cceac;
          auVar298._16_4_ = 0x3e4cceac;
          auVar298._20_4_ = 0x3e4cceac;
          auVar298._24_4_ = 0x3e4cceac;
          auVar298._28_4_ = 0x3e4cceac;
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar203,auVar298);
          auVar299._8_4_ = 0xbe7ffffc;
          auVar299._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar299._12_4_ = 0xbe7ffffc;
          auVar299._16_4_ = 0xbe7ffffc;
          auVar299._20_4_ = 0xbe7ffffc;
          auVar299._24_4_ = 0xbe7ffffc;
          auVar299._28_4_ = 0xbe7ffffc;
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar203,auVar299);
          auVar300._8_4_ = 0x3eaaaaaa;
          auVar300._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar300._12_4_ = 0x3eaaaaaa;
          auVar300._16_4_ = 0x3eaaaaaa;
          auVar300._20_4_ = 0x3eaaaaaa;
          auVar300._24_4_ = 0x3eaaaaaa;
          auVar300._28_4_ = 0x3eaaaaaa;
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar203,auVar300);
          auVar249._0_4_ = auVar234._0_4_ * auVar203._0_4_ * auVar131._0_4_;
          auVar249._4_4_ = auVar234._4_4_ * auVar203._4_4_ * auVar131._4_4_;
          auVar249._8_4_ = auVar234._8_4_ * auVar203._8_4_ * auVar131._8_4_;
          auVar249._12_4_ = auVar234._12_4_ * auVar203._12_4_ * auVar131._12_4_;
          auVar249._16_4_ = auVar234._16_4_ * auVar203._16_4_ * 0.0;
          auVar249._20_4_ = auVar234._20_4_ * auVar203._20_4_ * 0.0;
          auVar249._24_4_ = auVar234._24_4_ * auVar203._24_4_ * 0.0;
          auVar249._28_4_ = 0;
          auVar77 = vcvtdq2ps_avx(auVar80);
          auVar131 = vfmadd231ps_fma(auVar249,auVar77,auVar348);
          auVar131 = vfmsub231ps_fma(ZEXT1632(auVar131),auVar343,auVar234);
          auVar90 = vcmpps_avx(ZEXT1632(auVar214),_DAT_005a85e0,2);
          auVar88 = vsubps_avx(ZEXT1632(auVar131),auVar203);
          auVar131 = vfmsub231ps_fma(auVar88,auVar354,auVar77);
          auVar250._8_4_ = 0xc0000000;
          auVar250._0_8_ = 0xc0000000c0000000;
          auVar250._12_4_ = 0xc0000000;
          auVar250._16_4_ = 0xc0000000;
          auVar250._20_4_ = 0xc0000000;
          auVar250._24_4_ = 0xc0000000;
          auVar250._28_4_ = 0xc0000000;
          auVar22._4_4_ = auVar131._4_4_ * -2.0;
          auVar22._0_4_ = auVar131._0_4_ * -2.0;
          auVar22._8_4_ = auVar131._8_4_ * -2.0;
          auVar22._12_4_ = auVar131._12_4_ * -2.0;
          auVar22._16_4_ = 0x80000000;
          auVar22._20_4_ = 0x80000000;
          auVar22._24_4_ = 0x80000000;
          auVar22._28_4_ = auVar77._28_4_;
          auVar204._8_4_ = 0x7fffffff;
          auVar204._0_8_ = 0x7fffffff7fffffff;
          auVar204._12_4_ = 0x7fffffff;
          auVar204._16_4_ = 0x7fffffff;
          auVar204._20_4_ = 0x7fffffff;
          auVar204._24_4_ = 0x7fffffff;
          auVar204._28_4_ = 0x7fffffff;
          auVar90 = vblendvps_avx(auVar22,auVar204,auVar90);
          auVar164._8_4_ = 0x42b0c0a5;
          auVar164._0_8_ = 0x42b0c0a542b0c0a5;
          auVar164._12_4_ = 0x42b0c0a5;
          auVar164._16_4_ = 0x42b0c0a5;
          auVar164._20_4_ = 0x42b0c0a5;
          auVar164._24_4_ = 0x42b0c0a5;
          auVar164._28_4_ = 0x42b0c0a5;
          auVar90 = vminps_avx(auVar90,auVar164);
          auVar165._8_4_ = 0xc2b0c0a5;
          auVar165._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar165._12_4_ = 0xc2b0c0a5;
          auVar165._16_4_ = 0xc2b0c0a5;
          auVar165._20_4_ = 0xc2b0c0a5;
          auVar165._24_4_ = 0xc2b0c0a5;
          auVar165._28_4_ = 0xc2b0c0a5;
          auVar77 = vmaxps_avx(auVar90,auVar165);
          auVar166._8_4_ = 0x3fb8aa3b;
          auVar166._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar166._12_4_ = 0x3fb8aa3b;
          auVar166._16_4_ = 0x3fb8aa3b;
          auVar166._20_4_ = 0x3fb8aa3b;
          auVar166._24_4_ = 0x3fb8aa3b;
          auVar166._28_4_ = 0x3fb8aa3b;
          auVar131 = vfmadd213ps_fma(auVar166,auVar77,auVar343);
          auVar88 = vroundps_avx(ZEXT1632(auVar131),1);
          auVar90 = vcmpps_avx(ZEXT1632(auVar131),auVar88,1);
          auVar90 = vandps_avx(auVar269,auVar90);
          auVar90 = vsubps_avx(auVar88,auVar90);
          auVar131 = vfmsub231ps_fma(auVar77,auVar90,auVar354);
          auVar187 = vfnmsub231ps_fma(ZEXT1632(auVar131),auVar90,auVar348);
          auVar77 = ZEXT1632(auVar187);
          auVar23._28_4_ = auVar88._28_4_;
          auVar23._0_28_ =
               ZEXT1628(CONCAT412(auVar187._12_4_ * auVar187._12_4_,
                                  CONCAT48(auVar187._8_4_ * auVar187._8_4_,
                                           CONCAT44(auVar187._4_4_ * auVar187._4_4_,
                                                    auVar187._0_4_ * auVar187._0_4_))));
          auVar301._8_4_ = 0x3ab743ce;
          auVar301._0_8_ = 0x3ab743ce3ab743ce;
          auVar301._12_4_ = 0x3ab743ce;
          auVar301._16_4_ = 0x3ab743ce;
          auVar301._20_4_ = 0x3ab743ce;
          auVar301._24_4_ = 0x3ab743ce;
          auVar301._28_4_ = 0x3ab743ce;
          auVar131 = vfmadd213ps_fma(auVar368,auVar77,auVar301);
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar374);
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar270);
          auVar285 = ZEXT3264(auVar269);
          auVar302._8_4_ = 0x3e2aaaaa;
          auVar302._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar302._12_4_ = 0x3e2aaaaa;
          auVar302._16_4_ = 0x3e2aaaaa;
          auVar302._20_4_ = 0x3e2aaaaa;
          auVar302._24_4_ = 0x3e2aaaaa;
          auVar302._28_4_ = 0x3e2aaaaa;
          auVar77 = ZEXT1632(auVar187);
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar302);
          auVar131 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar77,auVar343);
          auVar214 = vfmadd213ps_fma(ZEXT1632(auVar131),auVar23,auVar77);
          auVar58._0_4_ = (int)auVar90._0_4_;
          auVar58._4_4_ = (int)auVar90._4_4_;
          auVar58._8_4_ = (int)auVar90._8_4_;
          auVar58._12_4_ = (int)auVar90._12_4_;
          auVar81._16_4_ = (int)auVar90._16_4_;
          auVar81._0_16_ = auVar58;
          auVar81._20_4_ = (int)auVar90._20_4_;
          auVar81._24_4_ = (int)auVar90._24_4_;
          auVar81._28_4_ = (int)auVar90._28_4_;
          auVar187 = vpslld_avx(auVar58,0x17);
          auVar131 = vpslld_avx(auVar81._16_16_,0x17);
          auVar131 = vpaddd_avx(auVar322,auVar131);
          auVar187 = vpaddd_avx(auVar322,auVar187);
          auVar82._16_16_ = auVar131;
          auVar82._0_16_ = auVar187;
          auVar167._0_4_ = fVar304 + auVar214._0_4_;
          auVar167._4_4_ = fVar316 + auVar214._4_4_;
          auVar167._8_4_ = fVar186 + auVar214._8_4_;
          auVar167._12_4_ = fVar317 + auVar214._12_4_;
          auVar167._16_4_ = fVar318 + 0.0;
          auVar167._20_4_ = fVar319 + 0.0;
          auVar167._24_4_ = fVar320 + 0.0;
          auVar167._28_4_ = fVar321 + 0.0;
          auVar131 = vfmadd213ps_fma(auVar82,auVar167,auVar269);
          auVar269 = vdivps_avx(auVar269,ZEXT1632(auVar131));
          auVar131 = vfnmadd213ps_fma(auVar269,auVar250,auVar361);
          auVar73 = ZEXT1628(auVar131);
          goto LAB_002ea51b;
        case 6:
          puVar35 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar1 = *puVar35;
          auVar87._4_4_ = uVar1;
          auVar87._0_4_ = uVar1;
          auVar87._8_4_ = uVar1;
          auVar87._12_4_ = uVar1;
          auVar87._16_4_ = uVar1;
          auVar87._20_4_ = uVar1;
          auVar87._24_4_ = uVar1;
          auVar87._28_4_ = uVar1;
          uVar1 = puVar35[1];
          auVar171._4_4_ = uVar1;
          auVar171._0_4_ = uVar1;
          auVar171._8_4_ = uVar1;
          auVar171._12_4_ = uVar1;
          auVar171._16_4_ = uVar1;
          auVar171._20_4_ = uVar1;
          auVar171._24_4_ = uVar1;
          auVar171._28_4_ = uVar1;
          auVar131 = vfmadd231ps_fma(auVar171,auVar112,auVar87);
          auVar90 = vmaxps_avx(ZEXT1632(auVar131),_DAT_005a85e0);
          auVar269 = vminps_avx(auVar90,auVar269);
          auVar73 = auVar269._0_28_;
LAB_002ea51b:
          auVar112._4_4_ = auVar73._4_4_ * fVar129;
          auVar112._0_4_ = auVar73._0_4_ * fVar94;
          auVar112._8_4_ = auVar73._8_4_ * auVar112._8_4_;
          auVar112._12_4_ = auVar73._12_4_ * auVar112._12_4_;
          auVar112._16_4_ = auVar73._16_4_ * auVar112._16_4_;
          auVar112._20_4_ = auVar73._20_4_ * auVar112._20_4_;
          auVar112._24_4_ = auVar73._24_4_ * auVar112._24_4_;
        }
        *(undefined1 (*) [32])((long)top_blob->data + uVar30 * 0x20) = auVar112;
        uVar30 = uVar30 + 1;
      } while (uVar30 != uVar28);
    }
    iVar37 = 0;
  }
LAB_002ec1a0:
  if ((int *)local_3c8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_3c8._8_8_ = *(int *)local_3c8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_3c8._8_8_ == 0) {
      if (local_3a8 == (Allocator *)0x0) {
        if ((void *)local_3c8._0_8_ != (void *)0x0) {
          free((void *)local_3c8._0_8_);
        }
      }
      else {
        (*local_3a8->_vptr_Allocator[3])();
      }
    }
  }
  return iVar37;
}

Assistant:

int InnerProduct_x86_fma::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}